

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [24];
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  float fVar89;
  float fVar90;
  undefined1 auVar88 [32];
  __m128 _outp_1;
  __m128 _b_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_pow op;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z_1;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_2;
  v4si emm0;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  int local_2294;
  undefined1 local_228d;
  int local_228c;
  float *local_2288;
  float *local_2280;
  undefined1 (*local_2278) [32];
  float *local_2270;
  undefined1 (*local_2268) [32];
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  float *local_2238;
  float *local_2230;
  undefined1 (*local_2228) [32];
  undefined8 local_2220;
  undefined8 uStack_2218;
  float *local_2210;
  undefined8 *local_2208;
  undefined8 *local_2200;
  undefined1 *local_21f8;
  undefined8 *local_21f0;
  undefined8 *local_21e8;
  undefined1 *local_21e0;
  float *local_21d8;
  undefined1 (*local_21d0) [32];
  undefined1 *local_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined1 local_2120 [8];
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined1 local_2100 [32];
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined1 local_20a0 [32];
  undefined1 local_2080 [8];
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined1 local_2060 [8];
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1ec0 [8];
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  ulong uStack_1ea8;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [8];
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined1 local_1e20 [32];
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined1 local_1dc0 [8];
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined1 local_1ce0 [32];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  ulong uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined1 *local_1b18;
  float *local_1b10;
  undefined1 *local_1b08;
  undefined1 *local_1b00;
  float *local_1af8;
  undefined1 *local_1af0;
  float *local_1ae8;
  undefined1 *local_1ae0;
  undefined1 *local_1ad8;
  float *local_1ad0;
  undefined1 *local_1ac8;
  undefined1 *local_1ac0;
  float *local_1ab8;
  undefined1 *local_1ab0;
  undefined1 *local_1aa8;
  float *local_1aa0;
  undefined1 *local_1a98;
  undefined1 *local_1a90;
  float *local_1a88;
  undefined1 *local_1a80;
  undefined1 *local_1a78;
  float *local_1a70;
  undefined1 *local_1a68;
  undefined1 *local_1a60;
  float *local_1a58;
  undefined1 *local_1a50;
  undefined1 *local_1a48;
  float *local_1a40;
  undefined1 *local_1a38;
  undefined1 *local_1a30;
  undefined1 *local_1a28;
  undefined1 *local_1a20;
  undefined1 *local_1a18;
  float *local_1a10;
  undefined1 *local_1a08;
  undefined1 *local_1a00;
  float *local_19f8;
  undefined1 *local_19f0;
  undefined1 *local_19e8;
  float *local_19e0;
  undefined1 *local_19d8;
  undefined1 *local_19d0;
  float *local_19c8;
  undefined1 *local_19c0;
  undefined1 *local_19b8;
  float *local_19b0;
  undefined1 *local_19a8;
  undefined1 *local_19a0;
  float *local_1998;
  float *local_1990;
  undefined1 *local_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined1 *local_1868;
  float *local_1860;
  float *local_1858;
  undefined1 *local_1850;
  float *local_1848;
  undefined1 *local_1840;
  undefined1 *local_1838;
  float *local_1830;
  undefined1 *local_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 local_1770;
  undefined8 uStack_1768;
  undefined1 local_1760 [16];
  undefined1 local_1750 [16];
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined4 local_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  float local_1620 [2];
  float afStack_1618 [2];
  float afStack_1610 [2];
  float afStack_1608 [2];
  float local_1600 [2];
  float afStack_15f8 [2];
  float afStack_15f0 [2];
  float afStack_15e8 [2];
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  float local_15c0 [2];
  float afStack_15b8 [2];
  float afStack_15b0 [2];
  float afStack_15a8 [2];
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  float local_1560 [2];
  float afStack_1558 [2];
  float afStack_1550 [2];
  float afStack_1548 [2];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float local_1500 [2];
  float afStack_14f8 [2];
  float afStack_14f0 [2];
  float afStack_14e8 [2];
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_14a0 [2];
  float afStack_1498 [2];
  float afStack_1490 [2];
  float afStack_1488 [2];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  float local_1440 [2];
  float afStack_1438 [2];
  float afStack_1430 [2];
  float afStack_1428 [2];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380 [2];
  float afStack_1378 [2];
  float afStack_1370 [2];
  float afStack_1368 [2];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  float local_1320 [2];
  float afStack_1318 [2];
  float afStack_1310 [2];
  float afStack_1308 [2];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  float local_12c0 [2];
  float afStack_12b8 [2];
  float afStack_12b0 [2];
  float afStack_12a8 [2];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260 [2];
  float afStack_1258 [2];
  float afStack_1250 [2];
  float afStack_1248 [2];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_1200 [2];
  float afStack_11f8 [2];
  float afStack_11f0 [2];
  float afStack_11e8 [2];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0 [2];
  float afStack_1198 [2];
  float afStack_1190 [2];
  float afStack_1188 [2];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140 [2];
  float afStack_1138 [2];
  float afStack_1130 [2];
  float afStack_1128 [2];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0 [2];
  float afStack_10d8 [2];
  float afStack_10d0 [2];
  float afStack_10c8 [2];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  ulong uStack_1068;
  float local_1060 [2];
  float afStack_1058 [2];
  float afStack_1050 [2];
  float afStack_1048 [2];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000 [2];
  float afStack_ff8 [2];
  float afStack_ff0 [2];
  float afStack_fe8 [2];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0 [2];
  float afStack_f98 [2];
  float afStack_f90 [2];
  float afStack_f88 [2];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  float local_f40 [2];
  float afStack_f38 [2];
  float afStack_f30 [2];
  float afStack_f28 [2];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0 [2];
  float afStack_ed8 [2];
  float afStack_ed0 [2];
  float afStack_ec8 [2];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined4 local_e54;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined4 local_e34;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 local_db0 [16];
  undefined1 local_da0 [16];
  undefined4 local_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined4 local_b94;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined4 local_b74;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined1 local_ad0 [8];
  undefined8 uStack_ac8;
  undefined1 local_ac0 [16];
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [8];
  undefined8 uStack_a88;
  undefined1 local_a80 [8];
  undefined8 uStack_a78;
  undefined1 local_a70 [8];
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined4 local_934;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [8];
  undefined8 uStack_918;
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [8];
  undefined8 uStack_8d8;
  undefined1 local_8d0 [16];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [8];
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined1 local_830 [16];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined4 local_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined1 *local_628;
  float *local_620;
  float *local_618;
  undefined1 *local_610;
  float *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  float *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  float *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  float *local_5c0;
  undefined1 *local_5b8;
  float *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  float *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  float *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  float *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  float *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  float *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  float *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  float *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  float *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  float *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  float *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  float *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  float *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  float local_410 [2];
  float afStack_408 [2];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  float local_3e0 [2];
  float afStack_3d8 [2];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  float local_3c0 [2];
  float afStack_3b8 [2];
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390 [2];
  float afStack_388 [2];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  float local_360 [2];
  float afStack_358 [2];
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330 [2];
  float afStack_328 [2];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270 [2];
  float afStack_268 [2];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  float local_240 [2];
  float afStack_238 [2];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_2288 = in_RDX;
  local_2280 = in_RSI;
  local_2278 = in_RDI;
  for (local_2294 = 0; local_2294 + 7 < in_ECX; local_2294 = local_2294 + 8) {
    local_2268 = local_2278;
    local_22c0 = *(undefined8 *)*local_2278;
    uStack_22b8 = *(undefined8 *)(*local_2278 + 8);
    uStack_22b0 = *(undefined8 *)(*local_2278 + 0x10);
    uStack_22a8 = *(undefined8 *)(*local_2278 + 0x18);
    local_2270 = local_2280;
    local_22e0 = *(undefined8 *)local_2280;
    uStack_22d8 = *(undefined8 *)(local_2280 + 2);
    uStack_22d0 = *(undefined8 *)(local_2280 + 4);
    uStack_22c8 = *(undefined8 *)(local_2280 + 6);
    local_21f8 = &local_228d;
    local_2200 = &local_22c0;
    local_2208 = &local_22e0;
    local_20e0 = 0x3f8000003f800000;
    uStack_20d8 = 0x3f8000003f800000;
    uStack_20d0 = 0x3f8000003f800000;
    uStack_20c8 = 0x3f8000003f800000;
    local_1b60 = 0;
    uStack_1b58 = 0;
    uStack_1b50 = 0;
    uStack_1b48 = 0;
    local_1e20 = vcmpps_avx(*local_2278,ZEXT1632(ZEXT816(0)),2);
    local_1dc0 = SUB168(*(undefined1 (*) [16])*local_2278,0);
    local_1b80 = local_1dc0;
    uStack_1db8 = SUB168(*(undefined1 (*) [16])*local_2278,8);
    uStack_1b78 = uStack_1db8;
    local_1ba0 = 0x80000000800000;
    uStack_1b98 = 0x80000000800000;
    uStack_1b90 = 0x80000000800000;
    uStack_1b88 = 0x80000000800000;
    auVar22._8_8_ = 0x80000000800000;
    auVar22._0_8_ = 0x80000000800000;
    auVar22._16_8_ = 0x80000000800000;
    auVar22._24_8_ = 0x80000000800000;
    auVar1 = vmaxps_avx(*local_2278,auVar22);
    local_1dc0 = auVar1._0_8_;
    local_d60 = local_1dc0;
    uStack_1db8 = auVar1._8_8_;
    uStack_d58 = uStack_1db8;
    uStack_1db0 = auVar1._16_8_;
    uStack_d50 = uStack_1db0;
    uStack_1da8 = auVar1._24_8_;
    uStack_d48 = uStack_1da8;
    local_d80 = local_1dc0;
    uStack_d78 = uStack_1db8;
    uStack_d70 = uStack_1db0;
    uStack_d68 = uStack_1da8;
    local_d84 = 0x17;
    local_e00 = local_1dc0;
    uStack_df8 = uStack_1db8;
    uStack_df0 = uStack_1db0;
    uStack_de8 = uStack_1da8;
    local_b70 = local_1dc0;
    uStack_b68 = uStack_1db8;
    local_b74 = 0x17;
    local_da0 = vpsrld_avx(auVar1._0_16_,ZEXT416(0x17));
    local_b90 = uStack_1db0;
    uStack_b88 = uStack_1da8;
    local_b94 = 0x17;
    local_db0 = vpsrld_avx(auVar1._16_16_,ZEXT416(0x17));
    local_e20 = local_da0._0_8_;
    uStack_e18 = local_da0._8_8_;
    uStack_e10 = local_db0._0_8_;
    uStack_e08 = local_db0._8_8_;
    local_de0 = local_da0._0_8_;
    uStack_dd8 = local_da0._8_8_;
    uStack_dd0 = local_db0._0_8_;
    uStack_dc8 = local_db0._8_8_;
    local_18e0 = local_1dc0;
    uStack_18d8 = uStack_1db8;
    uStack_18d0 = uStack_1db0;
    uStack_18c8 = uStack_1da8;
    local_1900 = 0x807fffff807fffff;
    uStack_18f8 = 0x807fffff807fffff;
    uStack_18f0 = 0x807fffff807fffff;
    uStack_18e8 = 0x807fffff807fffff;
    auVar24._8_8_ = 0x807fffff807fffff;
    auVar24._0_8_ = 0x807fffff807fffff;
    auVar24._16_8_ = 0x807fffff807fffff;
    auVar24._24_8_ = 0x807fffff807fffff;
    auVar1 = vandps_avx(auVar1,auVar24);
    local_1dc0 = auVar1._0_8_;
    local_ce0 = local_1dc0;
    uStack_1db8 = auVar1._8_8_;
    uStack_cd8 = uStack_1db8;
    uStack_1db0 = auVar1._16_8_;
    uStack_cd0 = uStack_1db0;
    uStack_1da8 = auVar1._24_8_;
    uStack_cc8 = uStack_1da8;
    local_d00 = 0x3f0000003f000000;
    uStack_cf8 = 0x3f0000003f000000;
    uStack_cf0 = 0x3f0000003f000000;
    uStack_ce8 = 0x3f0000003f000000;
    auVar48._8_8_ = 0x3f0000003f000000;
    auVar48._0_8_ = 0x3f0000003f000000;
    auVar48._16_8_ = 0x3f0000003f000000;
    auVar48._24_8_ = 0x3f0000003f000000;
    auVar2 = vorps_avx(auVar1,auVar48);
    local_be0 = local_da0._0_8_;
    uStack_bd8 = local_da0._8_8_;
    uStack_bd0 = local_db0._0_8_;
    uStack_bc8 = local_db0._8_8_;
    local_1740 = 0x7f0000007f;
    uStack_1738 = 0x7f0000007f;
    uStack_1730 = 0x7f0000007f;
    uStack_1728 = 0x7f0000007f;
    local_c80 = local_da0._0_8_;
    uStack_c78 = local_da0._8_8_;
    uStack_c70 = local_db0._0_8_;
    uStack_c68 = local_db0._8_8_;
    local_ca0 = 0x7f0000007f;
    uStack_c98 = 0x7f0000007f;
    uStack_c90 = 0x7f0000007f;
    uStack_c88 = 0x7f0000007f;
    local_c30 = 0x7f0000007f;
    uStack_c28 = 0x7f0000007f;
    local_c40 = 0x7f0000007f;
    uStack_c38 = 0x7f0000007f;
    local_b30 = local_da0._0_8_;
    uStack_b28 = local_da0._8_8_;
    local_b40 = 0x7f0000007f;
    uStack_b38 = 0x7f0000007f;
    auVar50._8_8_ = 0x7f0000007f;
    auVar50._0_8_ = 0x7f0000007f;
    local_c10 = vpsubd_avx(local_da0,auVar50);
    local_b50 = local_db0._0_8_;
    uStack_b48 = local_db0._8_8_;
    local_b60 = 0x7f0000007f;
    uStack_b58 = 0x7f0000007f;
    auVar4._8_8_ = 0x7f0000007f;
    auVar4._0_8_ = 0x7f0000007f;
    local_c20 = vpsubd_avx(local_db0,auVar4);
    local_cc0 = local_c10._0_8_;
    uStack_cb8 = local_c10._8_8_;
    uStack_cb0 = local_c20._0_8_;
    uStack_ca8 = local_c20._8_8_;
    local_c60 = local_c10._0_8_;
    uStack_c58 = local_c10._8_8_;
    uStack_c50 = local_c20._0_8_;
    uStack_c48 = local_c20._8_8_;
    local_1de0 = local_c10._0_8_;
    uStack_1dd8 = local_c10._8_8_;
    uStack_1dd0 = local_c20._0_8_;
    uStack_1dc8 = local_c20._8_8_;
    local_bc0 = local_c10._0_8_;
    uStack_bb8 = local_c10._8_8_;
    uStack_bb0 = local_c20._0_8_;
    uStack_ba8 = local_c20._8_8_;
    auVar49._16_8_ = local_c20._0_8_;
    auVar49._0_16_ = local_c10;
    auVar49._24_8_ = local_c20._8_8_;
    auVar1 = vcvtdq2ps_avx(auVar49);
    local_1e40 = auVar1._0_8_;
    uVar6 = local_1e40;
    uStack_1e38 = auVar1._8_8_;
    uVar7 = uStack_1e38;
    uStack_1e30 = auVar1._16_8_;
    uVar8 = uStack_1e30;
    uStack_1e28 = auVar1._24_8_;
    uVar9 = uStack_1e28;
    local_1d20 = 0x3f8000003f800000;
    uStack_1d18 = 0x3f8000003f800000;
    uStack_1d10 = 0x3f8000003f800000;
    uStack_1d08 = 0x3f8000003f800000;
    local_1d00._0_4_ = auVar1._0_4_;
    local_1d00._4_4_ = auVar1._4_4_;
    uStack_1cf8._0_4_ = auVar1._8_4_;
    uStack_1cf8._4_4_ = auVar1._12_4_;
    uStack_1cf0._0_4_ = auVar1._16_4_;
    uStack_1cf0._4_4_ = auVar1._20_4_;
    uStack_1ce8._0_4_ = auVar1._24_4_;
    uStack_1ce8._4_4_ = auVar1._28_4_;
    local_1e40._4_4_ = local_1d00._4_4_ + 1.0;
    local_1e40._0_4_ = (float)local_1d00 + 1.0;
    uStack_1e38._0_4_ = (float)uStack_1cf8 + 1.0;
    uStack_1e38._4_4_ = uStack_1cf8._4_4_ + 1.0;
    uStack_1e30._0_4_ = (float)uStack_1cf0 + 1.0;
    uStack_1e30._4_4_ = uStack_1cf0._4_4_ + 1.0;
    auVar87 = _local_1e40;
    uStack_1e28._0_4_ = (float)uStack_1ce8 + 1.0;
    uStack_1e28._4_4_ = uStack_1ce8._4_4_ + 1.0;
    auVar88 = _local_1e40;
    local_1e60 = vcmpps_avx(auVar2,_DAT_01faa560,1);
    local_1dc0 = auVar2._0_8_;
    local_1920 = local_1dc0;
    uStack_1db8 = auVar2._8_8_;
    uStack_1918 = uStack_1db8;
    uStack_1db0 = auVar2._16_8_;
    uStack_1910 = uStack_1db0;
    uStack_1da8 = auVar2._24_8_;
    uStack_1908 = uStack_1da8;
    local_1940 = local_1e60._0_8_;
    uStack_1938 = local_1e60._8_8_;
    uStack_1930 = local_1e60._16_8_;
    uStack_1928 = local_1e60._24_8_;
    local_1e80 = vandps_avx(auVar2,local_1e60);
    local_1c80 = local_1dc0;
    uStack_1c78 = uStack_1db8;
    uStack_1c70 = uStack_1db0;
    uStack_1c68 = uStack_1da8;
    local_1ca0 = 0x3f8000003f800000;
    uStack_1c98 = 0x3f8000003f800000;
    uStack_1c90 = 0x3f8000003f800000;
    uStack_1c88 = 0x3f8000003f800000;
    auVar21._8_8_ = 0x3f8000003f800000;
    auVar21._0_8_ = 0x3f8000003f800000;
    auVar21._16_8_ = 0x3f8000003f800000;
    auVar21._24_8_ = 0x3f8000003f800000;
    auVar1 = vsubps_avx(auVar2,auVar21);
    local_1cc0 = local_1e40;
    uStack_1cb8 = uStack_1e38;
    uStack_1e30 = auVar87._16_8_;
    uStack_1cb0 = uStack_1e30;
    uStack_1e28 = auVar88._24_8_;
    uStack_1ca8 = uStack_1e28;
    local_1960 = 0x3f8000003f800000;
    uStack_1958 = 0x3f8000003f800000;
    uStack_1950 = 0x3f8000003f800000;
    uStack_1948 = 0x3f8000003f800000;
    local_1980 = local_1e60._0_8_;
    uStack_1978 = local_1e60._8_8_;
    uStack_1970 = local_1e60._16_8_;
    uStack_1968 = local_1e60._24_8_;
    auVar23._8_8_ = 0x3f8000003f800000;
    auVar23._0_8_ = 0x3f8000003f800000;
    auVar23._16_8_ = 0x3f8000003f800000;
    auVar23._24_8_ = 0x3f8000003f800000;
    local_1ce0 = vandps_avx(auVar23,local_1e60);
    auVar20._16_8_ = uStack_1e30;
    auVar20._0_16_ = _local_1e40;
    auVar20._24_8_ = uStack_1e28;
    _local_1e40 = vsubps_avx(auVar20,local_1ce0);
    local_1dc0 = auVar1._0_8_;
    uVar10 = local_1dc0;
    uStack_1db8 = auVar1._8_8_;
    uVar11 = uStack_1db8;
    uStack_1db0 = auVar1._16_8_;
    uVar12 = uStack_1db0;
    uStack_1da8 = auVar1._24_8_;
    uVar13 = uStack_1da8;
    local_1d40._0_4_ = auVar1._0_4_;
    local_1d40._4_4_ = auVar1._4_4_;
    uStack_1d38._0_4_ = auVar1._8_4_;
    uStack_1d38._4_4_ = auVar1._12_4_;
    uStack_1d30._0_4_ = auVar1._16_4_;
    uStack_1d30._4_4_ = auVar1._20_4_;
    uStack_1d28._0_4_ = auVar1._24_4_;
    uStack_1d28._4_4_ = auVar1._28_4_;
    local_1d60._0_4_ = local_1e80._0_4_;
    local_1d60._4_4_ = local_1e80._4_4_;
    uStack_1d58._0_4_ = local_1e80._8_4_;
    uStack_1d58._4_4_ = local_1e80._12_4_;
    uStack_1d50._0_4_ = local_1e80._16_4_;
    uStack_1d50._4_4_ = local_1e80._20_4_;
    uStack_1d48._0_4_ = local_1e80._24_4_;
    uStack_1d48._4_4_ = local_1e80._28_4_;
    local_1dc0._0_4_ = (float)local_1d40 + (float)local_1d60;
    local_1dc0._4_4_ = local_1d40._4_4_ + local_1d60._4_4_;
    uStack_1d38._0_4_ = (float)uStack_1d38 + (float)uStack_1d58;
    uStack_1d38._4_4_ = uStack_1d38._4_4_ + uStack_1d58._4_4_;
    uStack_1d30._0_4_ = (float)uStack_1d30 + (float)uStack_1d50;
    uStack_1d30._4_4_ = uStack_1d30._4_4_ + uStack_1d50._4_4_;
    uStack_1d28._0_4_ = (float)uStack_1d28 + (float)uStack_1d48;
    fStack_1e84 = uStack_1d28._4_4_ + uStack_1d48._4_4_;
    uStack_1db8._0_4_ = (float)uStack_1d38;
    uStack_1db8._4_4_ = uStack_1d38._4_4_;
    uStack_1db0._0_4_ = (float)uStack_1d30;
    uStack_1db0._4_4_ = uStack_1d30._4_4_;
    auVar87 = _local_1dc0;
    uStack_1da8._0_4_ = (float)uStack_1d28;
    uStack_1da8._4_4_ = fStack_1e84;
    auVar1 = _local_1dc0;
    local_1be0 = local_1dc0;
    uStack_1bd8 = uStack_1db8;
    uStack_1db0 = auVar87._16_8_;
    uStack_1bd0 = uStack_1db0;
    uStack_1da8 = auVar1._24_8_;
    uStack_1bc8 = uStack_1da8;
    local_1ea0 = (float)local_1dc0._0_4_ * (float)local_1dc0._0_4_;
    fStack_1e9c = (float)local_1dc0._4_4_ * (float)local_1dc0._4_4_;
    fStack_1e98 = (float)uStack_1d38 * (float)uStack_1d38;
    fStack_1e94 = uStack_1d38._4_4_ * uStack_1d38._4_4_;
    fStack_1e90 = (float)uStack_1d30 * (float)uStack_1d30;
    fStack_1e8c = uStack_1d30._4_4_ * uStack_1d30._4_4_;
    fStack_1e88 = (float)uStack_1d28 * (float)uStack_1d28;
    uStack_1eb8 = 0x3d9021bb3d9021bb;
    local_1ec0 = (undefined1  [8])0x3d9021bb3d9021bb;
    uStack_1eb0 = 0x3d9021bb3d9021bb;
    uStack_1ea8 = 0x3d9021bb3d9021bb;
    local_1b00 = local_1ec0;
    local_1b18 = local_1dc0;
    local_1a40 = ::_ps256_cephes_log_p1;
    local_1340 = 0x3d9021bb3d9021bb;
    uStack_1338 = 0x3d9021bb3d9021bb;
    uStack_1330 = 0x3d9021bb3d9021bb;
    uStack_1328 = 0x3d9021bb3d9021bb;
    local_1360 = local_1dc0;
    uStack_1358 = uStack_1db8;
    uStack_1350 = uStack_1db0;
    uStack_1348 = uStack_1da8;
    local_1380[0] = -0.1151461;
    local_1380[1] = -0.1151461;
    afStack_1378[0] = -0.1151461;
    afStack_1378[1] = -0.1151461;
    afStack_1370[0] = -0.1151461;
    afStack_1370[1] = -0.1151461;
    afStack_1368[0] = -0.1151461;
    afStack_1368[1] = -0.1151461;
    auVar33._8_4_ = -0.1151461;
    auVar33._12_4_ = -0.1151461;
    auVar33._0_4_ = -0.1151461;
    auVar33._4_4_ = -0.1151461;
    auVar33._16_4_ = -0.1151461;
    auVar33._20_4_ = -0.1151461;
    auVar33._24_4_ = -0.1151461;
    auVar33._28_4_ = -0.1151461;
    auVar4 = vfmadd213ps_fma(auVar1,_local_1ec0,auVar33);
    local_1a58 = ::_ps256_cephes_log_p2;
    local_1ec0 = auVar4._0_8_;
    local_12e0 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uStack_12d8 = uStack_1eb8;
    uStack_12d0 = 0;
    uStack_12c8 = 0;
    local_1300 = local_1dc0;
    uStack_12f8 = uStack_1db8;
    uStack_12f0 = uStack_1db0;
    uStack_12e8 = uStack_1da8;
    local_1320[0] = 0.116769984;
    local_1320[1] = 0.116769984;
    afStack_1318[0] = 0.116769984;
    afStack_1318[1] = 0.116769984;
    afStack_1310[0] = 0.116769984;
    afStack_1310[1] = 0.116769984;
    afStack_1308[0] = 0.116769984;
    afStack_1308[1] = 0.116769984;
    auVar34._8_4_ = 0.116769984;
    auVar34._12_4_ = 0.116769984;
    auVar34._0_4_ = 0.116769984;
    auVar34._4_4_ = 0.116769984;
    auVar34._16_4_ = 0.116769984;
    auVar34._20_4_ = 0.116769984;
    auVar34._24_4_ = 0.116769984;
    auVar34._28_4_ = 0.116769984;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar34);
    local_1a70 = ::_ps256_cephes_log_p3;
    local_1ec0 = auVar4._0_8_;
    local_1280 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uStack_1278 = uStack_1eb8;
    uStack_1270 = 0;
    uStack_1268 = 0;
    local_12a0 = local_1dc0;
    uStack_1298 = uStack_1db8;
    uStack_1290 = uStack_1db0;
    uStack_1288 = uStack_1da8;
    local_12c0[0] = -0.12420141;
    local_12c0[1] = -0.12420141;
    afStack_12b8[0] = -0.12420141;
    afStack_12b8[1] = -0.12420141;
    afStack_12b0[0] = -0.12420141;
    afStack_12b0[1] = -0.12420141;
    afStack_12a8[0] = -0.12420141;
    afStack_12a8[1] = -0.12420141;
    auVar35._8_4_ = -0.12420141;
    auVar35._12_4_ = -0.12420141;
    auVar35._0_4_ = -0.12420141;
    auVar35._4_4_ = -0.12420141;
    auVar35._16_4_ = -0.12420141;
    auVar35._20_4_ = -0.12420141;
    auVar35._24_4_ = -0.12420141;
    auVar35._28_4_ = -0.12420141;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar35);
    local_1a88 = ::_ps256_cephes_log_p4;
    local_1ec0 = auVar4._0_8_;
    local_1220 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uStack_1218 = uStack_1eb8;
    uStack_1210 = 0;
    uStack_1208 = 0;
    local_1240 = local_1dc0;
    uStack_1238 = uStack_1db8;
    uStack_1230 = uStack_1db0;
    uStack_1228 = uStack_1da8;
    local_1260[0] = 0.14249323;
    local_1260[1] = 0.14249323;
    afStack_1258[0] = 0.14249323;
    afStack_1258[1] = 0.14249323;
    afStack_1250[0] = 0.14249323;
    afStack_1250[1] = 0.14249323;
    afStack_1248[0] = 0.14249323;
    afStack_1248[1] = 0.14249323;
    auVar36._8_4_ = 0.14249323;
    auVar36._12_4_ = 0.14249323;
    auVar36._0_4_ = 0.14249323;
    auVar36._4_4_ = 0.14249323;
    auVar36._16_4_ = 0.14249323;
    auVar36._20_4_ = 0.14249323;
    auVar36._24_4_ = 0.14249323;
    auVar36._28_4_ = 0.14249323;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar36);
    local_1aa0 = ::_ps256_cephes_log_p5;
    local_1ec0 = auVar4._0_8_;
    local_11c0 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uStack_11b8 = uStack_1eb8;
    uStack_11b0 = 0;
    uStack_11a8 = 0;
    local_11e0 = local_1dc0;
    uStack_11d8 = uStack_1db8;
    uStack_11d0 = uStack_1db0;
    uStack_11c8 = uStack_1da8;
    local_1200[0] = -0.16668057;
    local_1200[1] = -0.16668057;
    afStack_11f8[0] = -0.16668057;
    afStack_11f8[1] = -0.16668057;
    afStack_11f0[0] = -0.16668057;
    afStack_11f0[1] = -0.16668057;
    afStack_11e8[0] = -0.16668057;
    afStack_11e8[1] = -0.16668057;
    auVar37._8_4_ = -0.16668057;
    auVar37._12_4_ = -0.16668057;
    auVar37._0_4_ = -0.16668057;
    auVar37._4_4_ = -0.16668057;
    auVar37._16_4_ = -0.16668057;
    auVar37._20_4_ = -0.16668057;
    auVar37._24_4_ = -0.16668057;
    auVar37._28_4_ = -0.16668057;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar37);
    local_1ab8 = ::_ps256_cephes_log_p6;
    local_1ec0 = auVar4._0_8_;
    local_1160 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uStack_1158 = uStack_1eb8;
    uStack_1150 = 0;
    uStack_1148 = 0;
    local_1180 = local_1dc0;
    uStack_1178 = uStack_1db8;
    uStack_1170 = uStack_1db0;
    uStack_1168 = uStack_1da8;
    local_11a0[0] = 0.20000714;
    local_11a0[1] = 0.20000714;
    afStack_1198[0] = 0.20000714;
    afStack_1198[1] = 0.20000714;
    afStack_1190[0] = 0.20000714;
    afStack_1190[1] = 0.20000714;
    afStack_1188[0] = 0.20000714;
    afStack_1188[1] = 0.20000714;
    auVar38._8_4_ = 0.20000714;
    auVar38._12_4_ = 0.20000714;
    auVar38._0_4_ = 0.20000714;
    auVar38._4_4_ = 0.20000714;
    auVar38._16_4_ = 0.20000714;
    auVar38._20_4_ = 0.20000714;
    auVar38._24_4_ = 0.20000714;
    auVar38._28_4_ = 0.20000714;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar38);
    local_1ad0 = ::_ps256_cephes_log_p7;
    local_1ec0 = auVar4._0_8_;
    local_1100 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uStack_10f8 = uStack_1eb8;
    uStack_10f0 = 0;
    uStack_10e8 = 0;
    local_1120 = local_1dc0;
    uStack_1118 = uStack_1db8;
    uStack_1110 = uStack_1db0;
    uStack_1108 = uStack_1da8;
    local_1140[0] = -0.24999994;
    local_1140[1] = -0.24999994;
    afStack_1138[0] = -0.24999994;
    afStack_1138[1] = -0.24999994;
    afStack_1130[0] = -0.24999994;
    afStack_1130[1] = -0.24999994;
    afStack_1128[0] = -0.24999994;
    afStack_1128[1] = -0.24999994;
    auVar39._8_4_ = -0.24999994;
    auVar39._12_4_ = -0.24999994;
    auVar39._0_4_ = -0.24999994;
    auVar39._4_4_ = -0.24999994;
    auVar39._16_4_ = -0.24999994;
    auVar39._20_4_ = -0.24999994;
    auVar39._24_4_ = -0.24999994;
    auVar39._28_4_ = -0.24999994;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar39);
    local_1ae8 = ::_ps256_cephes_log_p8;
    local_1ec0 = auVar4._0_8_;
    local_10a0 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uStack_1098 = uStack_1eb8;
    uStack_1090 = 0;
    uStack_1088 = 0;
    local_10c0 = local_1dc0;
    uStack_10b8 = uStack_1db8;
    uStack_10b0 = uStack_1db0;
    uStack_10a8 = uStack_1da8;
    local_10e0[0] = 0.3333333;
    local_10e0[1] = 0.3333333;
    afStack_10d8[0] = 0.3333333;
    afStack_10d8[1] = 0.3333333;
    afStack_10d0[0] = 0.3333333;
    afStack_10d0[1] = 0.3333333;
    afStack_10c8[0] = 0.3333333;
    afStack_10c8[1] = 0.3333333;
    auVar40._8_4_ = 0.3333333;
    auVar40._12_4_ = 0.3333333;
    auVar40._0_4_ = 0.3333333;
    auVar40._4_4_ = 0.3333333;
    auVar40._16_4_ = 0.3333333;
    auVar40._20_4_ = 0.3333333;
    auVar40._24_4_ = 0.3333333;
    auVar40._28_4_ = 0.3333333;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar40);
    local_1ec0 = auVar4._0_8_;
    uVar14 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uVar15 = uStack_1eb8;
    uStack_1bf0 = 0;
    uStack_1be8 = 0;
    local_1c20 = local_1dc0;
    uStack_1c18 = uStack_1db8;
    uStack_1c10 = uStack_1db0;
    uStack_1c08 = uStack_1da8;
    local_1c00._0_4_ = auVar4._0_4_;
    local_1c00._4_4_ = auVar4._4_4_;
    uStack_1bf8._0_4_ = auVar4._8_4_;
    uStack_1bf8._4_4_ = auVar4._12_4_;
    local_1ec0._4_4_ = local_1c00._4_4_ * (float)local_1dc0._4_4_;
    local_1ec0._0_4_ = (float)local_1c00 * (float)local_1dc0._0_4_;
    uStack_1eb8._0_4_ = (float)uStack_1bf8 * (float)uStack_1d38;
    uStack_1eb8._4_4_ = uStack_1bf8._4_4_ * uStack_1d38._4_4_;
    uStack_1eb0._0_4_ = (float)uStack_1d30 * 0.0;
    uStack_1eb0._4_4_ = uStack_1d30._4_4_ * 0.0;
    auVar87 = _local_1ec0;
    local_1c40 = local_1ec0;
    uStack_1c38 = uStack_1eb8;
    uStack_1eb0 = auVar87._16_8_;
    uStack_1c30 = uStack_1eb0;
    uStack_1ea8 = (ulong)(uint)((float)uStack_1d28 * 0.0);
    uStack_1c28 = uStack_1ea8;
    local_1c60 = CONCAT44(fStack_1e9c,local_1ea0);
    uStack_1c58 = CONCAT44(fStack_1e94,fStack_1e98);
    uStack_1c50 = CONCAT44(fStack_1e8c,fStack_1e90);
    uStack_1c48 = CONCAT44(fStack_1e84,fStack_1e88);
    uStack_1ea8._0_4_ = (float)uStack_1d28 * 0.0 * fStack_1e88;
    local_1ec0._4_4_ = local_1c00._4_4_ * (float)local_1dc0._4_4_ * fStack_1e9c;
    local_1ec0._0_4_ = (float)local_1c00 * (float)local_1dc0._0_4_ * local_1ea0;
    uStack_1eb8._0_4_ = (float)uStack_1bf8 * (float)uStack_1d38 * fStack_1e98;
    uStack_1eb8._4_4_ = uStack_1bf8._4_4_ * uStack_1d38._4_4_ * fStack_1e94;
    uStack_1eb0._0_4_ = (float)uStack_1d30 * 0.0 * fStack_1e90;
    uStack_1eb0._4_4_ = uStack_1d30._4_4_ * 0.0 * fStack_1e8c;
    auVar87 = _local_1ec0;
    uStack_1ea8._4_4_ = 0;
    auVar1 = _local_1ec0;
    local_1b08 = local_1e40;
    local_1af8 = ::_ps256_cephes_log_q1;
    local_1040 = local_1e40;
    uStack_1038 = uStack_1e38;
    uStack_1030 = uStack_1e30;
    uStack_1028 = uStack_1e28;
    local_1060[0] = -0.00021219444;
    local_1060[1] = -0.00021219444;
    afStack_1058[0] = -0.00021219444;
    afStack_1058[1] = -0.00021219444;
    afStack_1050[0] = -0.00021219444;
    afStack_1050[1] = -0.00021219444;
    afStack_1048[0] = -0.00021219444;
    afStack_1048[1] = -0.00021219444;
    local_1080 = local_1ec0;
    uStack_1078 = uStack_1eb8;
    uStack_1eb0 = auVar87._16_8_;
    uStack_1070 = uStack_1eb0;
    uStack_1ea8 = (ulong)(uint)(float)uStack_1ea8;
    uStack_1068 = uStack_1ea8;
    auVar41._8_4_ = -0.00021219444;
    auVar41._12_4_ = -0.00021219444;
    auVar41._0_4_ = -0.00021219444;
    auVar41._4_4_ = -0.00021219444;
    auVar41._16_4_ = -0.00021219444;
    auVar41._20_4_ = -0.00021219444;
    auVar41._24_4_ = -0.00021219444;
    auVar41._28_4_ = -0.00021219444;
    auVar4 = vfmadd213ps_fma(auVar41,_local_1e40,auVar1);
    local_1858 = &local_1ea0;
    local_1860 = ::_ps256_0p5;
    local_ec0 = CONCAT44(fStack_1e9c,local_1ea0);
    uStack_eb8 = CONCAT44(fStack_1e94,fStack_1e98);
    uStack_eb0 = CONCAT44(fStack_1e8c,fStack_1e90);
    uStack_ea8 = CONCAT44(fStack_1e84,fStack_1e88);
    auVar85._4_4_ = fStack_1e9c;
    auVar85._0_4_ = local_1ea0;
    auVar85._8_4_ = fStack_1e98;
    auVar85._12_4_ = fStack_1e94;
    auVar85._16_4_ = fStack_1e90;
    auVar85._20_4_ = fStack_1e8c;
    auVar85._24_4_ = fStack_1e88;
    auVar85._28_4_ = fStack_1e84;
    local_ee0[0] = 0.5;
    local_ee0[1] = 0.5;
    afStack_ed8[0] = 0.5;
    afStack_ed8[1] = 0.5;
    afStack_ed0[0] = 0.5;
    afStack_ed0[1] = 0.5;
    afStack_ec8[0] = 0.5;
    afStack_ec8[1] = 0.5;
    local_1ec0 = auVar4._0_8_;
    local_f00 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uStack_ef8 = uStack_1eb8;
    uStack_ef0 = 0;
    uStack_ee8 = 0;
    auVar45._8_4_ = 0.5;
    auVar45._12_4_ = 0.5;
    auVar45._0_4_ = 0.5;
    auVar45._4_4_ = 0.5;
    auVar45._16_4_ = 0.5;
    auVar45._20_4_ = 0.5;
    auVar45._24_4_ = 0.5;
    auVar45._28_4_ = 0.5;
    auVar4 = vfnmadd213ps_fma(auVar45,auVar85,ZEXT1632(auVar4));
    local_1d80 = local_1dc0;
    uStack_1d78 = uStack_1db8;
    uStack_1d70 = uStack_1db0;
    uStack_1d68 = uStack_1da8;
    local_1ec0 = auVar4._0_8_;
    uVar16 = local_1ec0;
    uStack_1eb8 = auVar4._8_8_;
    uVar17 = uStack_1eb8;
    uStack_1d90 = 0;
    uStack_1d88 = 0;
    local_1da0._0_4_ = auVar4._0_4_;
    local_1da0._4_4_ = auVar4._4_4_;
    uStack_1d98._0_4_ = auVar4._8_4_;
    uStack_1d98._4_4_ = auVar4._12_4_;
    local_1dc0._4_4_ = (float)local_1dc0._4_4_ + local_1da0._4_4_;
    local_1dc0._0_4_ = (float)local_1dc0._0_4_ + (float)local_1da0;
    uStack_1db8._0_4_ = (float)uStack_1d38 + (float)uStack_1d98;
    uStack_1db8._4_4_ = uStack_1d38._4_4_ + uStack_1d98._4_4_;
    uStack_1db0._0_4_ = (float)uStack_1d30 + 0.0;
    uStack_1db0._4_4_ = uStack_1d30._4_4_ + 0.0;
    auVar87 = _local_1dc0;
    uStack_1da8._0_4_ = (float)uStack_1d28 + 0.0;
    uStack_1da8._4_4_ = fStack_1e84 + 0.0;
    auVar1 = _local_1dc0;
    local_1b10 = ::_ps256_cephes_log_q2;
    local_fe0 = local_1e40;
    uStack_fd8 = uStack_1e38;
    uStack_fd0 = uStack_1e30;
    uStack_fc8 = uStack_1e28;
    local_1000[0] = 0.6933594;
    local_1000[1] = 0.6933594;
    afStack_ff8[0] = 0.6933594;
    afStack_ff8[1] = 0.6933594;
    afStack_ff0[0] = 0.6933594;
    afStack_ff0[1] = 0.6933594;
    afStack_fe8[0] = 0.6933594;
    afStack_fe8[1] = 0.6933594;
    local_1020 = local_1dc0;
    uStack_1018 = uStack_1db8;
    uStack_1db0 = auVar87._16_8_;
    uStack_1010 = uStack_1db0;
    uStack_1da8 = auVar1._24_8_;
    uStack_1008 = uStack_1da8;
    auVar42._8_4_ = 0.6933594;
    auVar42._12_4_ = 0.6933594;
    auVar42._0_4_ = 0.6933594;
    auVar42._4_4_ = 0.6933594;
    auVar42._16_4_ = 0.6933594;
    auVar42._20_4_ = 0.6933594;
    auVar42._24_4_ = 0.6933594;
    auVar42._28_4_ = 0.6933594;
    auVar4 = vfmadd213ps_fma(auVar42,_local_1e40,auVar1);
    local_1dc0 = auVar4._0_8_;
    local_d20 = local_1dc0;
    uStack_1db8 = auVar4._8_8_;
    uStack_d18 = uStack_1db8;
    uStack_d10 = 0;
    uStack_d08 = 0;
    local_d40 = local_1e20._0_8_;
    uStack_d38 = local_1e20._8_8_;
    uStack_d30 = local_1e20._16_8_;
    uStack_d28 = local_1e20._24_8_;
    _local_1ec0 = vorps_avx(ZEXT1632(auVar4),local_1e20);
    local_2160._0_4_ = (float)local_22e0;
    local_2160._4_4_ = (float)((ulong)local_22e0 >> 0x20);
    uStack_2158._0_4_ = (float)uStack_22d8;
    uStack_2158._4_4_ = (float)((ulong)uStack_22d8 >> 0x20);
    uStack_2150._0_4_ = (float)uStack_22d0;
    uStack_2150._4_4_ = (float)((ulong)uStack_22d0 >> 0x20);
    uStack_2148._0_4_ = (float)uStack_22c8;
    uStack_2148._4_4_ = (undefined4)((ulong)uStack_22c8 >> 0x20);
    local_2180._0_4_ = local_1ec0._0_4_;
    local_2180._4_4_ = local_1ec0._4_4_;
    uStack_2178._0_4_ = local_1ec0._8_4_;
    uStack_2178._4_4_ = local_1ec0._12_4_;
    uStack_2170._0_4_ = local_1ec0._16_4_;
    uStack_2170._4_4_ = local_1ec0._20_4_;
    uStack_2168._0_4_ = local_1ec0._24_4_;
    local_2060._4_4_ = local_2160._4_4_ * local_2180._4_4_;
    local_2060._0_4_ = (float)local_2160 * (float)local_2180;
    uStack_2058._0_4_ = (float)uStack_2158 * (float)uStack_2178;
    uStack_2058._4_4_ = uStack_2158._4_4_ * uStack_2178._4_4_;
    uStack_2050._0_4_ = (float)uStack_2150 * (float)uStack_2170;
    uStack_2050._4_4_ = uStack_2150._4_4_ * uStack_2170._4_4_;
    auVar87 = _local_2060;
    uStack_2048._0_4_ = (float)uStack_2148 * (float)uStack_2168;
    uStack_2048._4_4_ = uStack_2148._4_4_;
    auVar1 = _local_2060;
    local_1b40 = 0;
    uStack_1b38 = 0;
    uStack_1b30 = 0;
    uStack_1b28 = 0;
    local_1ee0 = local_2060;
    uStack_1ed8 = uStack_2058;
    uStack_2050 = auVar87._16_8_;
    uStack_1ed0 = uStack_2050;
    uStack_2048 = auVar1._24_8_;
    uStack_1ec8 = uStack_2048;
    local_1f00 = 0x42b0c0a542b0c0a5;
    uStack_1ef8 = 0x42b0c0a542b0c0a5;
    uStack_1ef0 = 0x42b0c0a542b0c0a5;
    uStack_1ee8 = 0x42b0c0a542b0c0a5;
    auVar88._16_8_ = uStack_2050;
    auVar88._0_16_ = _local_2060;
    auVar88._24_8_ = uStack_2048;
    auVar1._8_8_ = 0x42b0c0a542b0c0a5;
    auVar1._0_8_ = 0x42b0c0a542b0c0a5;
    auVar1._16_8_ = 0x42b0c0a542b0c0a5;
    auVar1._24_8_ = 0x42b0c0a542b0c0a5;
    auVar1 = vminps_avx(auVar88,auVar1);
    local_2060 = auVar1._0_8_;
    local_1f20 = local_2060;
    uStack_2058 = auVar1._8_8_;
    uStack_1f18 = uStack_2058;
    uStack_2050 = auVar1._16_8_;
    uStack_1f10 = uStack_2050;
    uStack_2048 = auVar1._24_8_;
    uStack_1f08 = uStack_2048;
    local_1f40 = 0xc2b0c0a5c2b0c0a5;
    uStack_1f38 = 0xc2b0c0a5c2b0c0a5;
    uStack_1f30 = 0xc2b0c0a5c2b0c0a5;
    uStack_1f28 = 0xc2b0c0a5c2b0c0a5;
    auVar2._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar2._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar2._16_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar2._24_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar2 = vmaxps_avx(auVar1,auVar2);
    local_1a28 = local_2060;
    local_1990 = ::_ps256_cephes_LOG2EF;
    local_1998 = ::_ps256_0p5;
    local_2060 = auVar2._0_8_;
    local_15e0 = local_2060;
    uStack_2058 = auVar2._8_8_;
    uStack_15d8 = uStack_2058;
    uStack_2050 = auVar2._16_8_;
    uStack_15d0 = uStack_2050;
    uStack_2048 = auVar2._24_8_;
    uStack_15c8 = uStack_2048;
    local_1600[0] = 1.442695;
    local_1600[1] = 1.442695;
    afStack_15f8[0] = 1.442695;
    afStack_15f8[1] = 1.442695;
    afStack_15f0[0] = 1.442695;
    afStack_15f0[1] = 1.442695;
    afStack_15e8[0] = 1.442695;
    afStack_15e8[1] = 1.442695;
    local_1620[0] = 0.5;
    local_1620[1] = 0.5;
    afStack_1618[0] = 0.5;
    afStack_1618[1] = 0.5;
    afStack_1610[0] = 0.5;
    afStack_1610[1] = 0.5;
    afStack_1608[0] = 0.5;
    afStack_1608[1] = 0.5;
    auVar27._8_4_ = 1.442695;
    auVar27._12_4_ = 1.442695;
    auVar27._0_4_ = 1.442695;
    auVar27._4_4_ = 1.442695;
    auVar27._16_4_ = 1.442695;
    auVar27._20_4_ = 1.442695;
    auVar27._24_4_ = 1.442695;
    auVar27._28_4_ = 1.442695;
    auVar26._8_4_ = 0.5;
    auVar26._12_4_ = 0.5;
    auVar26._0_4_ = 0.5;
    auVar26._4_4_ = 0.5;
    auVar26._16_4_ = 0.5;
    auVar26._20_4_ = 0.5;
    auVar26._24_4_ = 0.5;
    auVar26._28_4_ = 0.5;
    auVar5 = vfmadd213ps_fma(auVar27,auVar2,auVar26);
    auVar88 = vroundps_avx(ZEXT1632(auVar5),1);
    auVar1 = vcmpps_avx(ZEXT1632(auVar5),auVar88,1);
    local_2100._0_8_ = auVar1._0_8_;
    local_18a0 = local_2100._0_8_;
    local_2100._8_8_ = auVar1._8_8_;
    uStack_1898 = local_2100._8_8_;
    local_2100._16_8_ = auVar1._16_8_;
    uStack_1890 = local_2100._16_8_;
    local_2100._24_8_ = auVar1._24_8_;
    uStack_1888 = local_2100._24_8_;
    local_18c0 = 0x3f8000003f800000;
    uStack_18b8 = 0x3f8000003f800000;
    uStack_18b0 = 0x3f8000003f800000;
    uStack_18a8 = 0x3f8000003f800000;
    auVar25._8_8_ = 0x3f8000003f800000;
    auVar25._0_8_ = 0x3f8000003f800000;
    auVar25._16_8_ = 0x3f8000003f800000;
    auVar25._24_8_ = 0x3f8000003f800000;
    local_2100 = vandps_avx(auVar1,auVar25);
    local_2080 = auVar88._0_8_;
    local_1fe0 = local_2080;
    uStack_2078 = auVar88._8_8_;
    uStack_1fd8 = uStack_2078;
    uStack_2070 = auVar88._16_8_;
    uStack_1fd0 = uStack_2070;
    uStack_2068 = auVar88._24_8_;
    uStack_1fc8 = uStack_2068;
    local_2000 = local_2100._0_8_;
    uStack_1ff8 = local_2100._8_8_;
    uStack_1ff0 = local_2100._16_8_;
    uStack_1fe8 = local_2100._24_8_;
    local_20a0 = vsubps_avx(auVar88,local_2100);
    local_1840 = local_20a0;
    local_1830 = ::_ps256_cephes_exp_C1;
    local_f80 = local_20a0._0_8_;
    uStack_f78 = local_20a0._8_8_;
    uStack_f70 = local_20a0._16_8_;
    uStack_f68 = local_20a0._24_8_;
    local_fa0[0] = 0.6933594;
    local_fa0[1] = 0.6933594;
    afStack_f98[0] = 0.6933594;
    afStack_f98[1] = 0.6933594;
    afStack_f90[0] = 0.6933594;
    afStack_f90[1] = 0.6933594;
    afStack_f88[0] = 0.6933594;
    afStack_f88[1] = 0.6933594;
    local_fc0 = local_2060;
    uStack_fb8 = uStack_2058;
    uStack_fb0 = uStack_2050;
    uStack_fa8 = uStack_2048;
    auVar43._8_4_ = 0.6933594;
    auVar43._12_4_ = 0.6933594;
    auVar43._0_4_ = 0.6933594;
    auVar43._4_4_ = 0.6933594;
    auVar43._16_4_ = 0.6933594;
    auVar43._20_4_ = 0.6933594;
    auVar43._24_4_ = 0.6933594;
    auVar43._28_4_ = 0.6933594;
    auVar5 = vfnmadd213ps_fma(auVar43,local_20a0,auVar2);
    local_1848 = ::_ps256_cephes_exp_C2;
    local_f20 = local_20a0._0_8_;
    uStack_f18 = local_20a0._8_8_;
    uStack_f10 = local_20a0._16_8_;
    uStack_f08 = local_20a0._24_8_;
    local_f40[0] = -0.00021219444;
    local_f40[1] = -0.00021219444;
    afStack_f38[0] = -0.00021219444;
    afStack_f38[1] = -0.00021219444;
    afStack_f30[0] = -0.00021219444;
    afStack_f30[1] = -0.00021219444;
    afStack_f28[0] = -0.00021219444;
    afStack_f28[1] = -0.00021219444;
    local_2060 = auVar5._0_8_;
    local_f60 = local_2060;
    uStack_2058 = auVar5._8_8_;
    uStack_f58 = uStack_2058;
    uStack_f50 = 0;
    uStack_f48 = 0;
    auVar44._8_4_ = -0.00021219444;
    auVar44._12_4_ = -0.00021219444;
    auVar44._0_4_ = -0.00021219444;
    auVar44._4_4_ = -0.00021219444;
    auVar44._16_4_ = -0.00021219444;
    auVar44._20_4_ = -0.00021219444;
    auVar44._24_4_ = -0.00021219444;
    auVar44._28_4_ = -0.00021219444;
    auVar5 = vfnmadd213ps_fma(auVar44,local_20a0,ZEXT1632(auVar5));
    auVar88 = ZEXT1632(auVar5);
    local_2060 = auVar5._0_8_;
    local_1f80 = local_2060;
    uStack_2058 = auVar5._8_8_;
    uStack_1f78 = uStack_2058;
    uStack_1f70 = 0;
    uStack_1f68 = 0;
    local_1f60._0_4_ = auVar5._0_4_;
    local_1f60._4_4_ = auVar5._4_4_;
    uStack_1f58._0_4_ = auVar5._8_4_;
    uStack_1f58._4_4_ = auVar5._12_4_;
    local_2080._4_4_ = local_1f60._4_4_ * local_1f60._4_4_;
    local_2080._0_4_ = (float)local_1f60 * (float)local_1f60;
    local_13c0 = local_2080;
    uStack_2078._0_4_ = (float)uStack_1f58 * (float)uStack_1f58;
    uStack_2078._4_4_ = uStack_1f58._4_4_ * uStack_1f58._4_4_;
    auVar3 = _local_2080;
    _local_2080 = ZEXT1632(_local_2080);
    auVar2 = _local_2080;
    uStack_2118 = 0x3950696739506967;
    local_2120 = (undefined1  [8])0x3950696739506967;
    uStack_2110 = 0x3950696739506967;
    uStack_2108 = 0x3950696739506967;
    local_1a18 = local_2120;
    local_19b0 = ::_ps256_cephes_exp_p1;
    local_1580 = 0x3950696739506967;
    uStack_1578 = 0x3950696739506967;
    uStack_1570 = 0x3950696739506967;
    uStack_1568 = 0x3950696739506967;
    local_15a0 = local_2060;
    uStack_1598 = uStack_2058;
    uStack_1590 = 0;
    uStack_1588 = 0;
    local_15c0[0] = 0.0013981999;
    local_15c0[1] = 0.0013981999;
    afStack_15b8[0] = 0.0013981999;
    afStack_15b8[1] = 0.0013981999;
    afStack_15b0[0] = 0.0013981999;
    afStack_15b0[1] = 0.0013981999;
    afStack_15a8[0] = 0.0013981999;
    afStack_15a8[1] = 0.0013981999;
    auVar28._8_4_ = 0.0013981999;
    auVar28._12_4_ = 0.0013981999;
    auVar28._0_4_ = 0.0013981999;
    auVar28._4_4_ = 0.0013981999;
    auVar28._16_4_ = 0.0013981999;
    auVar28._20_4_ = 0.0013981999;
    auVar28._24_4_ = 0.0013981999;
    auVar28._28_4_ = 0.0013981999;
    auVar5 = vfmadd213ps_fma(auVar88,_local_2120,auVar28);
    local_19c8 = ::_ps256_cephes_exp_p2;
    local_2120 = auVar5._0_8_;
    local_1520 = local_2120;
    uStack_2118 = auVar5._8_8_;
    uStack_1518 = uStack_2118;
    uStack_1510 = 0;
    uStack_1508 = 0;
    local_1540 = local_2060;
    uStack_1538 = uStack_2058;
    uStack_1530 = 0;
    uStack_1528 = 0;
    local_1560[0] = 0.008333452;
    local_1560[1] = 0.008333452;
    afStack_1558[0] = 0.008333452;
    afStack_1558[1] = 0.008333452;
    afStack_1550[0] = 0.008333452;
    afStack_1550[1] = 0.008333452;
    afStack_1548[0] = 0.008333452;
    afStack_1548[1] = 0.008333452;
    auVar29._8_4_ = 0.008333452;
    auVar29._12_4_ = 0.008333452;
    auVar29._0_4_ = 0.008333452;
    auVar29._4_4_ = 0.008333452;
    auVar29._16_4_ = 0.008333452;
    auVar29._20_4_ = 0.008333452;
    auVar29._24_4_ = 0.008333452;
    auVar29._28_4_ = 0.008333452;
    auVar5 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar5),auVar29);
    local_19e0 = ::_ps256_cephes_exp_p3;
    local_2120 = auVar5._0_8_;
    local_14c0 = local_2120;
    uStack_2118 = auVar5._8_8_;
    uStack_14b8 = uStack_2118;
    uStack_14b0 = 0;
    uStack_14a8 = 0;
    local_14e0 = local_2060;
    uStack_14d8 = uStack_2058;
    uStack_14d0 = 0;
    uStack_14c8 = 0;
    local_1500[0] = 0.041665796;
    local_1500[1] = 0.041665796;
    afStack_14f8[0] = 0.041665796;
    afStack_14f8[1] = 0.041665796;
    afStack_14f0[0] = 0.041665796;
    afStack_14f0[1] = 0.041665796;
    afStack_14e8[0] = 0.041665796;
    afStack_14e8[1] = 0.041665796;
    auVar30._8_4_ = 0.041665796;
    auVar30._12_4_ = 0.041665796;
    auVar30._0_4_ = 0.041665796;
    auVar30._4_4_ = 0.041665796;
    auVar30._16_4_ = 0.041665796;
    auVar30._20_4_ = 0.041665796;
    auVar30._24_4_ = 0.041665796;
    auVar30._28_4_ = 0.041665796;
    auVar5 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar5),auVar30);
    local_19f8 = ::_ps256_cephes_exp_p4;
    local_2120 = auVar5._0_8_;
    local_1460 = local_2120;
    uStack_2118 = auVar5._8_8_;
    uStack_1458 = uStack_2118;
    uStack_1450 = 0;
    uStack_1448 = 0;
    local_1480 = local_2060;
    uStack_1478 = uStack_2058;
    uStack_1470 = 0;
    uStack_1468 = 0;
    local_14a0[0] = 0.16666666;
    local_14a0[1] = 0.16666666;
    afStack_1498[0] = 0.16666666;
    afStack_1498[1] = 0.16666666;
    afStack_1490[0] = 0.16666666;
    afStack_1490[1] = 0.16666666;
    afStack_1488[0] = 0.16666666;
    afStack_1488[1] = 0.16666666;
    auVar31._8_4_ = 0.16666666;
    auVar31._12_4_ = 0.16666666;
    auVar31._0_4_ = 0.16666666;
    auVar31._4_4_ = 0.16666666;
    auVar31._16_4_ = 0.16666666;
    auVar31._20_4_ = 0.16666666;
    auVar31._24_4_ = 0.16666666;
    auVar31._28_4_ = 0.16666666;
    auVar5 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar5),auVar31);
    local_1a10 = ::_ps256_cephes_exp_p5;
    local_2120 = auVar5._0_8_;
    local_1400 = local_2120;
    uStack_2118 = auVar5._8_8_;
    uStack_13f8 = uStack_2118;
    uStack_13f0 = 0;
    uStack_13e8 = 0;
    local_1420 = local_2060;
    uStack_1418 = uStack_2058;
    uStack_1410 = 0;
    uStack_1408 = 0;
    local_1440[0] = 0.5;
    local_1440[1] = 0.5;
    afStack_1438[0] = 0.5;
    afStack_1438[1] = 0.5;
    afStack_1430[0] = 0.5;
    afStack_1430[1] = 0.5;
    afStack_1428[0] = 0.5;
    afStack_1428[1] = 0.5;
    auVar32._8_4_ = 0.5;
    auVar32._12_4_ = 0.5;
    auVar32._0_4_ = 0.5;
    auVar32._4_4_ = 0.5;
    auVar32._16_4_ = 0.5;
    auVar32._20_4_ = 0.5;
    auVar32._24_4_ = 0.5;
    auVar32._28_4_ = 0.5;
    auVar5 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar5),auVar32);
    local_1a20 = local_2080;
    local_2120 = auVar5._0_8_;
    local_13a0 = local_2120;
    uStack_2118 = auVar5._8_8_;
    uStack_1398 = uStack_2118;
    uStack_1390 = 0;
    uStack_1388 = 0;
    uStack_2078 = auVar3._8_8_;
    uStack_13b8 = uStack_2078;
    uStack_13b0 = 0;
    uStack_13a8 = 0;
    local_13e0 = local_2060;
    uStack_13d8 = uStack_2058;
    uStack_13d0 = 0;
    uStack_13c8 = 0;
    auVar5 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar5),auVar88);
    local_2120 = auVar5._0_8_;
    uVar18 = local_2120;
    uStack_2118 = auVar5._8_8_;
    uVar19 = uStack_2118;
    uStack_2010 = 0;
    uStack_2008 = 0;
    local_2040 = 0x3f8000003f800000;
    uStack_2038 = 0x3f8000003f800000;
    uStack_2030 = 0x3f8000003f800000;
    uStack_2028 = 0x3f8000003f800000;
    local_2020._0_4_ = auVar5._0_4_;
    local_2020._4_4_ = auVar5._4_4_;
    uStack_2018._0_4_ = auVar5._8_4_;
    uStack_2018._4_4_ = auVar5._12_4_;
    local_2120._4_4_ = local_2020._4_4_ + 1.0;
    local_2120._0_4_ = (float)local_2020 + 1.0;
    uStack_2118._0_4_ = (float)uStack_2018 + 1.0;
    uStack_2118._4_4_ = uStack_2018._4_4_ + 1.0;
    uStack_2110._0_4_ = 0x3f800000;
    uStack_2110._4_4_ = 0x3f800000;
    auVar87 = _local_2120;
    uStack_2108._0_4_ = 0x3f800000;
    uStack_2108._4_4_ = 0x3f800000;
    auVar1 = _local_2120;
    local_1820._0_4_ = local_20a0._0_4_;
    local_1820._4_4_ = local_20a0._4_4_;
    uStack_1818._0_4_ = local_20a0._8_4_;
    uStack_1818._4_4_ = local_20a0._12_4_;
    uStack_1810._0_4_ = local_20a0._16_4_;
    uStack_1810._4_4_ = local_20a0._20_4_;
    uStack_1808._0_4_ = local_20a0._24_4_;
    uStack_1808._4_4_ = local_20a0._28_4_;
    local_20c0 = CONCAT44((int)local_1820._4_4_,(int)(float)local_1820);
    uStack_20b8 = CONCAT44((int)uStack_1818._4_4_,(int)(float)uStack_1818);
    uStack_20b0 = CONCAT44((int)uStack_1810._4_4_,(int)(float)uStack_1810);
    uStack_20a8 = CONCAT44((int)uStack_1808._4_4_,(int)(float)uStack_1808);
    local_1720 = local_20c0;
    uStack_1718 = uStack_20b8;
    uStack_1710 = uStack_20b0;
    uStack_1708 = uStack_20a8;
    local_17c0 = local_20c0;
    uStack_17b8 = uStack_20b8;
    uStack_17b0 = uStack_20b0;
    uStack_17a8 = uStack_20a8;
    local_17e0 = 0x7f0000007f;
    uStack_17d8 = 0x7f0000007f;
    uStack_17d0 = 0x7f0000007f;
    uStack_17c8 = 0x7f0000007f;
    local_1770 = 0x7f0000007f;
    uStack_1768 = 0x7f0000007f;
    local_1780 = 0x7f0000007f;
    uStack_1778 = 0x7f0000007f;
    local_e70 = local_20c0;
    uStack_e68 = uStack_20b8;
    local_e80 = 0x7f0000007f;
    uStack_e78 = 0x7f0000007f;
    auVar47._8_8_ = uStack_20b8;
    auVar47._0_8_ = local_20c0;
    auVar46._8_8_ = 0x7f0000007f;
    auVar46._0_8_ = 0x7f0000007f;
    local_1750 = vpaddd_avx(auVar47,auVar46);
    local_e90 = uStack_20b0;
    uStack_e88 = uStack_20a8;
    local_ea0 = 0x7f0000007f;
    uStack_e98 = 0x7f0000007f;
    auVar3._8_8_ = uStack_20a8;
    auVar3._0_8_ = uStack_20b0;
    auVar5._8_8_ = 0x7f0000007f;
    auVar5._0_8_ = 0x7f0000007f;
    local_1760 = vpaddd_avx(auVar3,auVar5);
    local_1800 = local_1750._0_8_;
    uStack_17f8 = local_1750._8_8_;
    uStack_17f0 = local_1760._0_8_;
    uStack_17e8 = local_1760._8_8_;
    local_17a0 = local_1750._0_8_;
    uStack_1798 = local_1750._8_8_;
    uStack_1790 = local_1760._0_8_;
    uStack_1788 = local_1760._8_8_;
    local_1660 = local_1750._0_8_;
    uStack_1658 = local_1750._8_8_;
    uStack_1650 = local_1760._0_8_;
    uStack_1648 = local_1760._8_8_;
    local_1664 = 0x17;
    local_16e0 = local_1750._0_8_;
    uStack_16d8 = local_1750._8_8_;
    uStack_16d0 = local_1760._0_8_;
    uStack_16c8 = local_1760._8_8_;
    local_e30 = local_1750._0_8_;
    uStack_e28 = local_1750._8_8_;
    local_e34 = 0x17;
    local_1680 = vpslld_avx(local_1750,ZEXT416(0x17));
    local_e50 = local_1760._0_8_;
    uStack_e48 = local_1760._8_8_;
    local_e54 = 0x17;
    local_1690 = vpslld_avx(local_1760,ZEXT416(0x17));
    local_1700 = local_1680._0_8_;
    uStack_16f8 = local_1680._8_8_;
    uStack_16f0 = local_1690._0_8_;
    uStack_16e8 = local_1690._8_8_;
    local_16c0 = local_1680._0_8_;
    uStack_16b8 = local_1680._8_8_;
    uStack_16b0 = local_1690._0_8_;
    uStack_16a8 = local_1690._8_8_;
    local_20c0 = local_1680._0_8_;
    uStack_20b8 = local_1680._8_8_;
    uStack_20b0 = local_1690._0_8_;
    uStack_20a8 = local_1690._8_8_;
    local_1640 = local_1680._0_8_;
    uStack_1638 = local_1680._8_8_;
    uStack_1630 = local_1690._0_8_;
    uStack_1628 = local_1690._8_8_;
    local_2140 = local_1680._0_8_;
    uStack_2138 = local_1680._8_8_;
    uStack_2130 = local_1690._0_8_;
    uStack_2128 = local_1690._8_8_;
    local_1fa0 = local_2120;
    uStack_1f98 = uStack_2118;
    uStack_2110 = auVar87._16_8_;
    uStack_1f90 = uStack_2110;
    uStack_2108 = auVar1._24_8_;
    uStack_1f88 = uStack_2108;
    local_1fc0._0_4_ = local_1680._0_4_;
    local_1fc0._4_4_ = local_1680._4_4_;
    uStack_1fb8._0_4_ = local_1680._8_4_;
    uStack_1fb8._4_4_ = local_1680._12_4_;
    uStack_1fb0._0_4_ = local_1690._0_4_;
    uStack_1fb0._4_4_ = local_1690._4_4_;
    uStack_1fa8._0_4_ = local_1690._8_4_;
    local_2120._4_4_ = (local_2020._4_4_ + 1.0) * local_1fc0._4_4_;
    local_2120._0_4_ = ((float)local_2020 + 1.0) * (float)local_1fc0;
    uStack_2118._0_4_ = ((float)uStack_2018 + 1.0) * (float)uStack_1fb8;
    uStack_2118._4_4_ = (uStack_2018._4_4_ + 1.0) * uStack_1fb8._4_4_;
    uStack_2110._0_4_ = (float)uStack_1fb0 * 1.0;
    uStack_2110._4_4_ = uStack_1fb0._4_4_ * 1.0;
    auVar87 = _local_2120;
    uStack_2108._0_4_ = (float)uStack_1fa8 * 1.0;
    uStack_2108._4_4_ = 0x3f800000;
    auVar1 = _local_2120;
    local_2300 = local_2120;
    uStack_22f8 = uStack_2118;
    uStack_2110 = auVar87._16_8_;
    uStack_22f0 = uStack_2110;
    uStack_2108 = auVar1._24_8_;
    uStack_22e8 = uStack_2108;
    local_2238 = local_2288;
    local_2260 = local_2120;
    uStack_2258 = uStack_2118;
    uStack_2250 = uStack_2110;
    uStack_2248 = uStack_2108;
    *(undefined1 (*) [8])local_2288 = local_2120;
    *(undefined8 *)(local_2288 + 2) = uStack_2118;
    *(undefined8 *)(local_2288 + 4) = uStack_2110;
    *(undefined8 *)(local_2288 + 6) = uStack_2108;
    local_2278 = local_2278 + 1;
    local_2280 = local_2280 + 8;
    local_2288 = local_2288 + 8;
    local_21c0 = local_22e0;
    uStack_21b8 = uStack_22d8;
    uStack_21b0 = uStack_22d0;
    uStack_21a8 = uStack_22c8;
    local_21a0 = local_22c0;
    uStack_2198 = uStack_22b8;
    uStack_2190 = uStack_22b0;
    uStack_2188 = uStack_22a8;
    local_2180 = local_1ec0;
    uStack_2178 = uStack_1eb8;
    uStack_2170 = uStack_1eb0;
    uStack_2168 = uStack_1ea8;
    local_2160 = local_22e0;
    uStack_2158 = uStack_22d8;
    uStack_2150 = uStack_22d0;
    uStack_2148 = uStack_22c8;
    _local_2120 = auVar1;
    _local_2080 = auVar2;
    _local_2060 = auVar88;
    local_2020 = uVar18;
    uStack_2018 = uVar19;
    local_1fc0 = local_1680._0_8_;
    uStack_1fb8 = local_1680._8_8_;
    uStack_1fb0 = local_1690._0_8_;
    uStack_1fa8 = local_1690._8_8_;
    local_1f60 = local_1f80;
    uStack_1f58 = uStack_1f78;
    uStack_1f50 = uStack_1f70;
    uStack_1f48 = uStack_1f68;
    local_1e00 = local_20e0;
    uStack_1df8 = uStack_20d8;
    uStack_1df0 = uStack_20d0;
    uStack_1de8 = uStack_20c8;
    _local_1dc0 = ZEXT1632(auVar4);
    local_1da0 = uVar16;
    uStack_1d98 = uVar17;
    local_1d60 = local_1e80._0_8_;
    uStack_1d58 = local_1e80._8_8_;
    uStack_1d50 = local_1e80._16_8_;
    uStack_1d48 = local_1e80._24_8_;
    local_1d40 = uVar10;
    uStack_1d38 = uVar11;
    uStack_1d30 = uVar12;
    uStack_1d28 = uVar13;
    local_1d00 = uVar6;
    uStack_1cf8 = uVar7;
    uStack_1cf0 = uVar8;
    uStack_1ce8 = uVar9;
    local_1c00 = uVar14;
    uStack_1bf8 = uVar15;
    local_1bc0 = local_1be0;
    uStack_1bb8 = uStack_1bd8;
    uStack_1bb0 = uStack_1bd0;
    uStack_1ba8 = uStack_1bc8;
    uStack_1b70 = uStack_22b0;
    uStack_1b68 = uStack_22a8;
    local_1af0 = local_1b08;
    local_1ae0 = local_1b18;
    local_1ad8 = local_1b00;
    local_1ac8 = local_1b18;
    local_1ac0 = local_1b00;
    local_1ab0 = local_1b18;
    local_1aa8 = local_1b00;
    local_1a98 = local_1b18;
    local_1a90 = local_1b00;
    local_1a80 = local_1b18;
    local_1a78 = local_1b00;
    local_1a68 = local_1b18;
    local_1a60 = local_1b00;
    local_1a50 = local_1b18;
    local_1a48 = local_1b00;
    local_1a38 = local_1b18;
    local_1a30 = local_1b00;
    local_1a08 = local_1a28;
    local_1a00 = local_1a18;
    local_19f0 = local_1a28;
    local_19e8 = local_1a18;
    local_19d8 = local_1a28;
    local_19d0 = local_1a18;
    local_19c0 = local_1a28;
    local_19b8 = local_1a18;
    local_19a8 = local_1a28;
    local_19a0 = local_1a18;
    local_1988 = local_1a28;
    local_1868 = local_1b00;
    local_1850 = local_1a28;
    local_1838 = local_1a28;
    local_1828 = local_1840;
    local_1820 = local_20a0._0_8_;
    uStack_1818 = local_20a0._8_8_;
    uStack_1810 = local_20a0._16_8_;
    uStack_1808 = local_20a0._24_8_;
    local_c00 = local_1740;
    uStack_bf8 = uStack_1738;
    uStack_bf0 = uStack_1730;
    uStack_be8 = uStack_1728;
  }
  for (; local_228c = in_ECX, local_2294 + 3 < in_ECX; local_2294 = local_2294 + 4) {
    local_2228 = local_2278;
    local_2310 = *(undefined8 *)*local_2278;
    uStack_2308 = *(undefined8 *)(*local_2278 + 8);
    local_2230 = local_2280;
    local_2320 = *(undefined8 *)local_2280;
    uStack_2318 = *(undefined8 *)(local_2280 + 2);
    local_21e0 = &local_228d;
    local_21e8 = &local_2310;
    local_21f0 = &local_2320;
    local_ab0 = 0x3f8000003f800000;
    uStack_aa8 = 0x3f8000003f800000;
    local_730 = 0;
    uStack_728 = 0;
    local_c0 = 0;
    uStack_b8 = 0;
    local_8d0 = vcmpps_avx(*(undefined1 (*) [16])*local_2278,ZEXT816(0),2);
    local_790 = 0x80000000800000;
    uStack_788 = 0x80000000800000;
    auVar58._8_8_ = 0x80000000800000;
    auVar58._0_8_ = 0x80000000800000;
    auVar4 = vmaxps_avx(*(undefined1 (*) [16])*local_2278,auVar58);
    local_8a0 = auVar4._0_8_;
    local_a0 = local_8a0;
    uStack_898 = auVar4._8_8_;
    uStack_98 = uStack_898;
    local_760 = local_8a0;
    uStack_758 = uStack_898;
    local_764 = 0x17;
    auVar3 = vpsrld_avx(auVar4,ZEXT416(0x17));
    local_660 = local_8a0;
    uStack_658 = uStack_898;
    local_670 = 0x807fffff807fffff;
    uStack_668 = 0x807fffff807fffff;
    auVar63._8_8_ = 0x807fffff807fffff;
    auVar63._0_8_ = 0x807fffff807fffff;
    auVar4 = vpand_avx(auVar4,auVar63);
    local_8a0 = auVar4._0_8_;
    local_60 = local_8a0;
    uStack_898 = auVar4._8_8_;
    uStack_58 = uStack_898;
    local_a40 = 0x3f0000003f000000;
    uStack_a38 = 0x3f0000003f000000;
    auVar83._8_8_ = 0x3f0000003f000000;
    auVar83._0_8_ = 0x3f0000003f000000;
    auVar5 = vpor_avx(auVar4,auVar83);
    local_8b0._0_8_ = auVar3._0_8_;
    local_740 = local_8b0._0_8_;
    local_8b0._8_8_ = auVar3._8_8_;
    uStack_738 = local_8b0._8_8_;
    local_960 = 0x7f0000007f;
    uStack_958 = 0x7f0000007f;
    auVar59._8_8_ = 0x7f0000007f;
    auVar59._0_8_ = 0x7f0000007f;
    local_8b0 = vpsubd_avx(auVar3,auVar59);
    local_6f0 = local_8b0._0_8_;
    uStack_6e8 = local_8b0._8_8_;
    auVar4 = vcvtdq2ps_avx(local_8b0);
    local_8e0 = auVar4._0_8_;
    uVar6 = local_8e0;
    uStack_8d8 = auVar4._8_8_;
    uVar7 = uStack_8d8;
    local_850 = 0x3f8000003f800000;
    uStack_848 = 0x3f8000003f800000;
    local_840._0_4_ = auVar4._0_4_;
    local_840._4_4_ = auVar4._4_4_;
    uStack_838._0_4_ = auVar4._8_4_;
    uStack_838._4_4_ = auVar4._12_4_;
    local_8e0._4_4_ = local_840._4_4_ + 1.0;
    local_8e0._0_4_ = (float)local_840 + 1.0;
    uStack_8d8._0_4_ = (float)uStack_838 + 1.0;
    uStack_8d8._4_4_ = uStack_838._4_4_ + 1.0;
    local_8a0 = auVar5._0_8_;
    local_40 = local_8a0;
    uStack_898 = auVar5._8_8_;
    uStack_38 = uStack_898;
    local_50 = 0x3f3504f33f3504f3;
    uStack_48 = 0x3f3504f33f3504f3;
    auVar84._8_8_ = 0x3f3504f33f3504f3;
    auVar84._0_8_ = 0x3f3504f33f3504f3;
    local_8f0 = vcmpps_avx(auVar5,auVar84,1);
    local_680 = local_8a0;
    uStack_678 = uStack_898;
    local_690 = local_8f0._0_8_;
    uStack_688 = local_8f0._8_8_;
    local_900 = vpand_avx(auVar5,local_8f0);
    local_800 = local_8a0;
    uStack_7f8 = uStack_898;
    local_810 = 0x3f8000003f800000;
    uStack_808 = 0x3f8000003f800000;
    auVar57._8_8_ = 0x3f8000003f800000;
    auVar57._0_8_ = 0x3f8000003f800000;
    auVar4 = vsubps_avx(auVar5,auVar57);
    local_820 = local_8e0;
    uStack_818 = uStack_8d8;
    local_6a0 = 0x3f8000003f800000;
    uStack_698 = 0x3f8000003f800000;
    local_6b0 = local_8f0._0_8_;
    uStack_6a8 = local_8f0._8_8_;
    auVar62._8_8_ = 0x3f8000003f800000;
    auVar62._0_8_ = 0x3f8000003f800000;
    local_830 = vpand_avx(auVar62,local_8f0);
    auVar56._8_8_ = uStack_8d8;
    auVar56._0_8_ = local_8e0;
    _local_8e0 = vsubps_avx(auVar56,local_830);
    local_8a0 = auVar4._0_8_;
    uVar8 = local_8a0;
    uStack_898 = auVar4._8_8_;
    uVar9 = uStack_898;
    local_860._0_4_ = auVar4._0_4_;
    local_860._4_4_ = auVar4._4_4_;
    uStack_858._0_4_ = auVar4._8_4_;
    uStack_858._4_4_ = auVar4._12_4_;
    local_870._0_4_ = local_900._0_4_;
    local_870._4_4_ = local_900._4_4_;
    uStack_868._0_4_ = local_900._8_4_;
    uStack_868._4_4_ = local_900._12_4_;
    local_8a0._0_4_ = (float)local_860 + (float)local_870;
    local_8a0._4_4_ = local_860._4_4_ + local_870._4_4_;
    uStack_858._0_4_ = (float)uStack_858 + (float)uStack_868;
    uStack_858._4_4_ = uStack_858._4_4_ + uStack_868._4_4_;
    uStack_898._0_4_ = (float)uStack_858;
    uStack_898._4_4_ = uStack_858._4_4_;
    local_7b0 = local_8a0;
    uStack_7a8 = uStack_898;
    local_910 = (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
    fStack_90c = (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
    fStack_908 = (float)uStack_858 * (float)uStack_858;
    fStack_904 = uStack_858._4_4_ * uStack_858._4_4_;
    uStack_918 = 0x3d9021bb3d9021bb;
    local_920 = (undefined1  [8])0x3d9021bb3d9021bb;
    local_628 = local_920;
    local_5e0 = local_8a0;
    local_508 = ::_ps_cephes_log_p1;
    local_280 = 0x3d9021bb3d9021bb;
    uStack_278 = 0x3d9021bb3d9021bb;
    local_290 = local_8a0;
    uStack_288 = uStack_898;
    local_2a0[0] = -0.1151461;
    local_2a0[1] = -0.1151461;
    afStack_298[0] = -0.1151461;
    afStack_298[1] = -0.1151461;
    auVar73._8_4_ = -0.1151461;
    auVar73._12_4_ = -0.1151461;
    auVar73._0_4_ = -0.1151461;
    auVar73._4_4_ = -0.1151461;
    auVar4 = vfmadd213ps_fma(_local_8a0,_local_920,auVar73);
    local_520 = ::_ps_cephes_log_p2;
    local_920 = auVar4._0_8_;
    local_250 = local_920;
    uStack_918 = auVar4._8_8_;
    uStack_248 = uStack_918;
    local_260 = local_8a0;
    uStack_258 = uStack_898;
    local_270[0] = 0.116769984;
    local_270[1] = 0.116769984;
    afStack_268[0] = 0.116769984;
    afStack_268[1] = 0.116769984;
    auVar74._8_4_ = 0.116769984;
    auVar74._12_4_ = 0.116769984;
    auVar74._0_4_ = 0.116769984;
    auVar74._4_4_ = 0.116769984;
    auVar4 = vfmadd213ps_fma(_local_8a0,auVar4,auVar74);
    local_538 = ::_ps_cephes_log_p3;
    local_920 = auVar4._0_8_;
    local_220 = local_920;
    uStack_918 = auVar4._8_8_;
    uStack_218 = uStack_918;
    local_230 = local_8a0;
    uStack_228 = uStack_898;
    local_240[0] = -0.12420141;
    local_240[1] = -0.12420141;
    afStack_238[0] = -0.12420141;
    afStack_238[1] = -0.12420141;
    auVar75._8_4_ = -0.12420141;
    auVar75._12_4_ = -0.12420141;
    auVar75._0_4_ = -0.12420141;
    auVar75._4_4_ = -0.12420141;
    auVar4 = vfmadd213ps_fma(_local_8a0,auVar4,auVar75);
    local_550 = ::_ps_cephes_log_p4;
    local_920 = auVar4._0_8_;
    local_1f0 = local_920;
    uStack_918 = auVar4._8_8_;
    uStack_1e8 = uStack_918;
    local_200 = local_8a0;
    uStack_1f8 = uStack_898;
    local_210[0] = 0.14249323;
    local_210[1] = 0.14249323;
    afStack_208[0] = 0.14249323;
    afStack_208[1] = 0.14249323;
    auVar76._8_4_ = 0.14249323;
    auVar76._12_4_ = 0.14249323;
    auVar76._0_4_ = 0.14249323;
    auVar76._4_4_ = 0.14249323;
    auVar4 = vfmadd213ps_fma(_local_8a0,auVar4,auVar76);
    local_568 = ::_ps_cephes_log_p5;
    local_920 = auVar4._0_8_;
    local_1c0 = local_920;
    uStack_918 = auVar4._8_8_;
    uStack_1b8 = uStack_918;
    local_1d0 = local_8a0;
    uStack_1c8 = uStack_898;
    local_1e0[0] = -0.16668057;
    local_1e0[1] = -0.16668057;
    afStack_1d8[0] = -0.16668057;
    afStack_1d8[1] = -0.16668057;
    auVar77._8_4_ = -0.16668057;
    auVar77._12_4_ = -0.16668057;
    auVar77._0_4_ = -0.16668057;
    auVar77._4_4_ = -0.16668057;
    auVar4 = vfmadd213ps_fma(_local_8a0,auVar4,auVar77);
    local_580 = ::_ps_cephes_log_p6;
    local_920 = auVar4._0_8_;
    local_190 = local_920;
    uStack_918 = auVar4._8_8_;
    uStack_188 = uStack_918;
    local_1a0 = local_8a0;
    uStack_198 = uStack_898;
    local_1b0[0] = 0.20000714;
    local_1b0[1] = 0.20000714;
    afStack_1a8[0] = 0.20000714;
    afStack_1a8[1] = 0.20000714;
    auVar78._8_4_ = 0.20000714;
    auVar78._12_4_ = 0.20000714;
    auVar78._0_4_ = 0.20000714;
    auVar78._4_4_ = 0.20000714;
    auVar4 = vfmadd213ps_fma(_local_8a0,auVar4,auVar78);
    local_598 = ::_ps_cephes_log_p7;
    local_920 = auVar4._0_8_;
    local_160 = local_920;
    uStack_918 = auVar4._8_8_;
    uStack_158 = uStack_918;
    local_170 = local_8a0;
    uStack_168 = uStack_898;
    local_180[0] = -0.24999994;
    local_180[1] = -0.24999994;
    afStack_178[0] = -0.24999994;
    afStack_178[1] = -0.24999994;
    auVar79._8_4_ = -0.24999994;
    auVar79._12_4_ = -0.24999994;
    auVar79._0_4_ = -0.24999994;
    auVar79._4_4_ = -0.24999994;
    auVar4 = vfmadd213ps_fma(_local_8a0,auVar4,auVar79);
    local_5b0 = ::_ps_cephes_log_p8;
    local_920 = auVar4._0_8_;
    local_130 = local_920;
    uStack_918 = auVar4._8_8_;
    uStack_128 = uStack_918;
    local_140 = local_8a0;
    uStack_138 = uStack_898;
    local_150[0] = 0.3333333;
    local_150[1] = 0.3333333;
    afStack_148[0] = 0.3333333;
    afStack_148[1] = 0.3333333;
    auVar80._8_4_ = 0.3333333;
    auVar80._12_4_ = 0.3333333;
    auVar80._0_4_ = 0.3333333;
    auVar80._4_4_ = 0.3333333;
    auVar4 = vfmadd213ps_fma(_local_8a0,auVar4,auVar80);
    local_920 = auVar4._0_8_;
    uVar10 = local_920;
    uStack_918 = auVar4._8_8_;
    uVar11 = uStack_918;
    local_7d0 = local_8a0;
    uStack_7c8 = uStack_898;
    local_7c0._0_4_ = auVar4._0_4_;
    local_7c0._4_4_ = auVar4._4_4_;
    uStack_7b8._0_4_ = auVar4._8_4_;
    uStack_7b8._4_4_ = auVar4._12_4_;
    local_920._4_4_ = local_7c0._4_4_ * (float)local_8a0._4_4_;
    local_920._0_4_ = (float)local_7c0 * (float)local_8a0._0_4_;
    uStack_918._0_4_ = (float)uStack_7b8 * (float)uStack_858;
    uStack_918._4_4_ = uStack_7b8._4_4_ * uStack_858._4_4_;
    local_7e0 = local_920;
    uStack_7d8 = uStack_918;
    local_7f0 = CONCAT44(fStack_90c,local_910);
    uStack_7e8 = CONCAT44(fStack_904,fStack_908);
    local_920._4_4_ = local_7c0._4_4_ * (float)local_8a0._4_4_ * fStack_90c;
    local_920._0_4_ = (float)local_7c0 * (float)local_8a0._0_4_ * local_910;
    uStack_918._0_4_ = (float)uStack_7b8 * (float)uStack_858 * fStack_908;
    uStack_918._4_4_ = uStack_7b8._4_4_ * uStack_858._4_4_ * fStack_904;
    local_5d0 = local_8e0;
    local_5c0 = ::_ps_cephes_log_q1;
    local_100 = local_8e0;
    uStack_f8 = uStack_8d8;
    local_110[0] = -0.00021219444;
    local_110[1] = -0.00021219444;
    afStack_108[0] = -0.00021219444;
    afStack_108[1] = -0.00021219444;
    local_120 = local_920;
    uStack_118 = uStack_918;
    auVar81._8_4_ = -0.00021219444;
    auVar81._12_4_ = -0.00021219444;
    auVar81._0_4_ = -0.00021219444;
    auVar81._4_4_ = -0.00021219444;
    auVar4 = vfmadd213ps_fma(auVar81,_local_8e0,_local_920);
    local_618 = &local_910;
    local_620 = ::_ps_0p5;
    local_3d0 = CONCAT44(fStack_90c,local_910);
    uStack_3c8 = CONCAT44(fStack_904,fStack_908);
    auVar86._4_4_ = fStack_90c;
    auVar86._0_4_ = local_910;
    auVar86._8_4_ = fStack_908;
    auVar86._12_4_ = fStack_904;
    local_3e0[0] = 0.5;
    local_3e0[1] = 0.5;
    afStack_3d8[0] = 0.5;
    afStack_3d8[1] = 0.5;
    local_920 = auVar4._0_8_;
    local_3f0 = local_920;
    uStack_918 = auVar4._8_8_;
    uStack_3e8 = uStack_918;
    auVar67._8_4_ = 0.5;
    auVar67._12_4_ = 0.5;
    auVar67._0_4_ = 0.5;
    auVar67._4_4_ = 0.5;
    _local_920 = vfnmadd213ps_fma(auVar67,auVar86,auVar4);
    local_880 = local_8a0;
    uStack_878 = uStack_898;
    local_890._0_4_ = local_920._0_4_;
    local_890._4_4_ = local_920._4_4_;
    uStack_888._0_4_ = local_920._8_4_;
    uStack_888._4_4_ = local_920._12_4_;
    local_8a0._4_4_ = (float)local_8a0._4_4_ + local_890._4_4_;
    local_8a0._0_4_ = (float)local_8a0._0_4_ + (float)local_890;
    uStack_898._0_4_ = (float)uStack_858 + (float)uStack_888;
    uStack_898._4_4_ = uStack_858._4_4_ + uStack_888._4_4_;
    local_5d8 = ::_ps_cephes_log_q2;
    local_d0 = local_8e0;
    uStack_c8 = uStack_8d8;
    local_e0[0] = 0.6933594;
    local_e0[1] = 0.6933594;
    afStack_d8[0] = 0.6933594;
    afStack_d8[1] = 0.6933594;
    local_f0 = local_8a0;
    uStack_e8 = uStack_898;
    auVar82._8_4_ = 0.6933594;
    auVar82._12_4_ = 0.6933594;
    auVar82._0_4_ = 0.6933594;
    auVar82._4_4_ = 0.6933594;
    auVar4 = vfmadd213ps_fma(auVar82,_local_8e0,_local_8a0);
    local_8a0 = auVar4._0_8_;
    local_80 = local_8a0;
    uStack_898 = auVar4._8_8_;
    uStack_78 = uStack_898;
    local_90 = local_8d0._0_8_;
    uStack_88 = local_8d0._8_8_;
    _local_8a0 = vpor_avx(auVar4,local_8d0);
    local_af0._0_4_ = (float)local_2320;
    local_af0._4_4_ = (float)((ulong)local_2320 >> 0x20);
    uStack_ae8._0_4_ = (float)uStack_2318;
    uStack_ae8._4_4_ = (float)((ulong)uStack_2318 >> 0x20);
    local_b00._0_4_ = local_8a0._0_4_;
    local_b00._4_4_ = local_8a0._4_4_;
    uStack_af8._0_4_ = local_8a0._8_4_;
    uStack_af8._4_4_ = local_8a0._12_4_;
    local_a70._4_4_ = local_af0._4_4_ * local_b00._4_4_;
    local_a70._0_4_ = (float)local_af0 * (float)local_b00;
    uStack_a68._0_4_ = (float)uStack_ae8 * (float)uStack_af8;
    uStack_a68._4_4_ = uStack_ae8._4_4_ * uStack_af8._4_4_;
    local_720 = 0;
    uStack_718 = 0;
    local_970 = local_a70;
    uStack_968 = uStack_a68;
    local_980 = 0x42b0c0a542b0c0a5;
    uStack_978 = 0x42b0c0a542b0c0a5;
    auVar53._8_8_ = uStack_a68;
    auVar53._0_8_ = local_a70;
    auVar52._8_8_ = 0x42b0c0a542b0c0a5;
    auVar52._0_8_ = 0x42b0c0a542b0c0a5;
    auVar4 = vminps_avx(auVar53,auVar52);
    local_a70 = auVar4._0_8_;
    local_990 = local_a70;
    uStack_a68 = auVar4._8_8_;
    uStack_988 = uStack_a68;
    local_9a0 = 0xc2b0c0a5c2b0c0a5;
    uStack_998 = 0xc2b0c0a5c2b0c0a5;
    auVar51._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar51._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3 = vmaxps_avx(auVar4,auVar51);
    local_a70 = auVar3._0_8_;
    uVar12 = local_a70;
    uStack_a68 = auVar3._8_8_;
    uVar13 = uStack_a68;
    local_9c0 = 0x3fb8aa3b3fb8aa3b;
    uStack_9b8 = 0x3fb8aa3b3fb8aa3b;
    local_9b0._0_4_ = auVar3._0_4_;
    local_9b0._4_4_ = auVar3._4_4_;
    uStack_9a8._0_4_ = auVar3._8_4_;
    uStack_9a8._4_4_ = auVar3._12_4_;
    local_a90._4_4_ = local_9b0._4_4_ * 1.442695;
    local_a90._0_4_ = (float)local_9b0 * 1.442695;
    uStack_a88._0_4_ = (float)uStack_9a8 * 1.442695;
    uStack_a88._4_4_ = uStack_9a8._4_4_ * 1.442695;
    local_a30 = local_a90;
    uStack_a28 = uStack_a88;
    local_a90._0_4_ = (float)local_9b0 * 1.442695 + 0.5;
    local_a90._4_4_ = local_9b0._4_4_ * 1.442695 + 0.5;
    fVar89 = (float)uStack_9a8 * 1.442695 + 0.5;
    fVar90 = uStack_9a8._4_4_ * 1.442695 + 0.5;
    uStack_a88._0_4_ = fVar89;
    uStack_a88._4_4_ = fVar90;
    local_700 = local_a90;
    uStack_6f8 = uStack_a88;
    local_aa0._4_4_ = (int)(float)local_a90._4_4_;
    local_aa0._0_4_ = (int)(float)local_a90._0_4_;
    local_aa0._8_4_ = (int)fVar89;
    local_aa0._12_4_ = (int)fVar90;
    local_6e0 = local_aa0._0_8_;
    uStack_6d8 = local_aa0._8_8_;
    auVar60._8_8_ = local_aa0._8_8_;
    auVar60._0_8_ = local_aa0._0_8_;
    auVar5 = vcvtdq2ps_avx(auVar60);
    local_a80 = auVar5._0_8_;
    local_6c0 = local_a80;
    uStack_a78 = auVar5._8_8_;
    uStack_6b8 = uStack_a78;
    local_6d0 = local_a90;
    uStack_6c8 = uStack_a88;
    auVar61._8_8_ = uStack_a88;
    auVar61._0_8_ = local_a90;
    auVar4 = vcmpps_avx(auVar61,auVar5,1);
    local_ac0._0_8_ = auVar4._0_8_;
    local_640 = local_ac0._0_8_;
    local_ac0._8_8_ = auVar4._8_8_;
    uStack_638 = local_ac0._8_8_;
    local_650 = 0x3f8000003f800000;
    uStack_648 = 0x3f8000003f800000;
    auVar64._8_8_ = 0x3f8000003f800000;
    auVar64._0_8_ = 0x3f8000003f800000;
    local_ac0 = vpand_avx(auVar4,auVar64);
    local_a10 = local_a80;
    uStack_a08 = uStack_a78;
    local_a20 = local_ac0._0_8_;
    uStack_a18 = local_ac0._8_8_;
    _local_a90 = vsubps_avx(auVar5,local_ac0);
    local_600 = local_a90;
    local_5f0 = ::_ps_cephes_exp_C1;
    local_610 = local_a70;
    local_430 = local_a90;
    uStack_428 = uStack_a88;
    local_440[0] = 0.6933594;
    local_440[1] = 0.6933594;
    afStack_438[0] = 0.6933594;
    afStack_438[1] = 0.6933594;
    local_450 = local_a70;
    uStack_448 = uStack_a68;
    auVar65._8_4_ = 0.6933594;
    auVar65._12_4_ = 0.6933594;
    auVar65._0_4_ = 0.6933594;
    auVar65._4_4_ = 0.6933594;
    auVar4 = vfnmadd213ps_fma(auVar65,_local_a90,auVar3);
    local_608 = ::_ps_cephes_exp_C2;
    local_400 = local_a90;
    uStack_3f8 = uStack_a88;
    local_410[0] = -0.00021219444;
    local_410[1] = -0.00021219444;
    afStack_408[0] = -0.00021219444;
    afStack_408[1] = -0.00021219444;
    local_a70 = auVar4._0_8_;
    local_420 = local_a70;
    uStack_a68 = auVar4._8_8_;
    uStack_418 = uStack_a68;
    auVar66._8_4_ = -0.00021219444;
    auVar66._12_4_ = -0.00021219444;
    auVar66._0_4_ = -0.00021219444;
    auVar66._4_4_ = -0.00021219444;
    _local_a70 = vfnmadd213ps_fma(auVar66,_local_a90,auVar4);
    local_9e0 = local_a70;
    uStack_9d8 = uStack_a68;
    local_9d0._0_4_ = local_a70._0_4_;
    local_9d0._4_4_ = local_a70._4_4_;
    uStack_9c8._0_4_ = local_a70._8_4_;
    uStack_9c8._4_4_ = local_a70._12_4_;
    local_a80._4_4_ = local_9d0._4_4_ * local_9d0._4_4_;
    local_a80._0_4_ = (float)local_9d0 * (float)local_9d0;
    uStack_a78._0_4_ = (float)uStack_9c8 * (float)uStack_9c8;
    uStack_a78._4_4_ = uStack_9c8._4_4_ * uStack_9c8._4_4_;
    uStack_ac8 = 0x3950696739506967;
    local_ad0 = (undefined1  [8])0x3950696739506967;
    local_4e0 = local_ad0;
    local_478 = ::_ps_cephes_exp_p1;
    local_3a0 = 0x3950696739506967;
    uStack_398 = 0x3950696739506967;
    local_3b0 = local_a70;
    uStack_3a8 = uStack_a68;
    local_3c0[0] = 0.0013981999;
    local_3c0[1] = 0.0013981999;
    afStack_3b8[0] = 0.0013981999;
    afStack_3b8[1] = 0.0013981999;
    auVar68._8_4_ = 0.0013981999;
    auVar68._12_4_ = 0.0013981999;
    auVar68._0_4_ = 0.0013981999;
    auVar68._4_4_ = 0.0013981999;
    auVar4 = vfmadd213ps_fma(_local_a70,_local_ad0,auVar68);
    local_490 = ::_ps_cephes_exp_p2;
    local_ad0 = auVar4._0_8_;
    local_370 = local_ad0;
    uStack_ac8 = auVar4._8_8_;
    uStack_368 = uStack_ac8;
    local_380 = local_a70;
    uStack_378 = uStack_a68;
    local_390[0] = 0.008333452;
    local_390[1] = 0.008333452;
    afStack_388[0] = 0.008333452;
    afStack_388[1] = 0.008333452;
    auVar69._8_4_ = 0.008333452;
    auVar69._12_4_ = 0.008333452;
    auVar69._0_4_ = 0.008333452;
    auVar69._4_4_ = 0.008333452;
    auVar4 = vfmadd213ps_fma(_local_a70,auVar4,auVar69);
    local_4a8 = ::_ps_cephes_exp_p3;
    local_ad0 = auVar4._0_8_;
    local_340 = local_ad0;
    uStack_ac8 = auVar4._8_8_;
    uStack_338 = uStack_ac8;
    local_350 = local_a70;
    uStack_348 = uStack_a68;
    local_360[0] = 0.041665796;
    local_360[1] = 0.041665796;
    afStack_358[0] = 0.041665796;
    afStack_358[1] = 0.041665796;
    auVar70._8_4_ = 0.041665796;
    auVar70._12_4_ = 0.041665796;
    auVar70._0_4_ = 0.041665796;
    auVar70._4_4_ = 0.041665796;
    auVar4 = vfmadd213ps_fma(_local_a70,auVar4,auVar70);
    local_4c0 = ::_ps_cephes_exp_p4;
    local_ad0 = auVar4._0_8_;
    local_310 = local_ad0;
    uStack_ac8 = auVar4._8_8_;
    uStack_308 = uStack_ac8;
    local_320 = local_a70;
    uStack_318 = uStack_a68;
    local_330[0] = 0.16666666;
    local_330[1] = 0.16666666;
    afStack_328[0] = 0.16666666;
    afStack_328[1] = 0.16666666;
    auVar71._8_4_ = 0.16666666;
    auVar71._12_4_ = 0.16666666;
    auVar71._0_4_ = 0.16666666;
    auVar71._4_4_ = 0.16666666;
    auVar4 = vfmadd213ps_fma(_local_a70,auVar4,auVar71);
    local_4d8 = ::_ps_cephes_exp_p5;
    local_ad0 = auVar4._0_8_;
    local_2e0 = local_ad0;
    uStack_ac8 = auVar4._8_8_;
    uStack_2d8 = uStack_ac8;
    local_2f0 = local_a70;
    uStack_2e8 = uStack_a68;
    local_300[0] = 0.5;
    local_300[1] = 0.5;
    afStack_2f8[0] = 0.5;
    afStack_2f8[1] = 0.5;
    auVar72._8_4_ = 0.5;
    auVar72._12_4_ = 0.5;
    auVar72._0_4_ = 0.5;
    auVar72._4_4_ = 0.5;
    auVar4 = vfmadd213ps_fma(_local_a70,auVar4,auVar72);
    local_4e8 = local_a80;
    local_ad0 = auVar4._0_8_;
    local_2b0 = local_ad0;
    uStack_ac8 = auVar4._8_8_;
    uStack_2a8 = uStack_ac8;
    local_2c0 = local_a80;
    uStack_2b8 = uStack_a78;
    local_2d0 = local_a70;
    uStack_2c8 = uStack_a68;
    auVar4 = vfmadd213ps_fma(_local_a80,auVar4,_local_a70);
    local_ad0 = auVar4._0_8_;
    uVar14 = local_ad0;
    uStack_ac8 = auVar4._8_8_;
    uVar15 = uStack_ac8;
    local_a60 = 0x3f8000003f800000;
    uStack_a58 = 0x3f8000003f800000;
    local_a50._0_4_ = auVar4._0_4_;
    local_a50._4_4_ = auVar4._4_4_;
    uStack_a48._0_4_ = auVar4._8_4_;
    uStack_a48._4_4_ = auVar4._12_4_;
    local_ad0._4_4_ = local_a50._4_4_ + 1.0;
    local_ad0._0_4_ = (float)local_a50 + 1.0;
    uStack_ac8._0_4_ = (float)uStack_a48 + 1.0;
    uStack_ac8._4_4_ = uStack_a48._4_4_ + 1.0;
    local_710._0_4_ = local_a90._0_4_;
    local_710._4_4_ = local_a90._4_4_;
    uStack_708._0_4_ = local_a90._8_4_;
    uStack_708._4_4_ = local_a90._12_4_;
    local_aa0._4_4_ = (int)local_710._4_4_;
    local_aa0._0_4_ = (int)(float)local_710;
    local_aa0._8_4_ = (int)(float)uStack_708;
    local_aa0._12_4_ = (int)uStack_708._4_4_;
    local_950 = local_aa0._0_8_;
    uStack_948 = local_aa0._8_8_;
    auVar55._8_8_ = local_aa0._8_8_;
    auVar55._0_8_ = local_aa0._0_8_;
    auVar54._8_8_ = 0x7f0000007f;
    auVar54._0_8_ = 0x7f0000007f;
    auVar4 = vpaddd_avx(auVar55,auVar54);
    local_aa0._0_8_ = auVar4._0_8_;
    local_930 = local_aa0._0_8_;
    local_aa0._8_8_ = auVar4._8_8_;
    uStack_928 = local_aa0._8_8_;
    local_934 = 0x17;
    local_aa0 = vpslld_avx(auVar4,ZEXT416(0x17));
    local_460 = local_aa0._0_8_;
    uStack_458 = local_aa0._8_8_;
    local_ae0 = local_aa0._0_8_;
    uStack_ad8 = local_aa0._8_8_;
    local_9f0 = local_ad0;
    uStack_9e8 = uStack_ac8;
    local_a00._0_4_ = local_aa0._0_4_;
    local_a00._4_4_ = local_aa0._4_4_;
    uStack_9f8._0_4_ = local_aa0._8_4_;
    uStack_9f8._4_4_ = local_aa0._12_4_;
    local_ad0._4_4_ = (local_a50._4_4_ + 1.0) * local_a00._4_4_;
    local_ad0._0_4_ = ((float)local_a50 + 1.0) * (float)local_a00;
    uStack_ac8._0_4_ = ((float)uStack_a48 + 1.0) * (float)uStack_9f8;
    uStack_ac8._4_4_ = (uStack_a48._4_4_ + 1.0) * uStack_9f8._4_4_;
    local_2210 = local_2288;
    local_2220 = local_ad0;
    uStack_2218 = uStack_ac8;
    *(undefined1 (*) [8])local_2288 = local_ad0;
    *(undefined8 *)(local_2288 + 2) = uStack_ac8;
    local_2278 = (undefined1 (*) [32])(*local_2278 + 0x10);
    local_2280 = local_2280 + 4;
    local_2288 = local_2288 + 4;
    local_b20 = local_2320;
    uStack_b18 = uStack_2318;
    local_b10 = local_2310;
    uStack_b08 = uStack_2308;
    local_b00 = local_8a0;
    uStack_af8 = uStack_898;
    local_af0 = local_2320;
    uStack_ae8 = uStack_2318;
    local_a50 = uVar14;
    uStack_a48 = uVar15;
    local_a00 = local_aa0._0_8_;
    uStack_9f8 = local_aa0._8_8_;
    local_9d0 = local_9e0;
    uStack_9c8 = uStack_9d8;
    local_9b0 = uVar12;
    uStack_9a8 = uVar13;
    local_8c0 = local_ab0;
    uStack_8b8 = uStack_aa8;
    local_890 = local_920;
    uStack_888 = uStack_918;
    local_870 = local_900._0_8_;
    uStack_868 = local_900._8_8_;
    local_860 = uVar8;
    uStack_858 = uVar9;
    local_840 = uVar6;
    uStack_838 = uVar7;
    local_7c0 = uVar10;
    uStack_7b8 = uVar11;
    local_7a0 = local_7b0;
    uStack_798 = uStack_7a8;
    local_780 = local_2310;
    uStack_778 = uStack_2308;
    local_750 = local_960;
    uStack_748 = uStack_958;
    local_710 = local_a90;
    uStack_708 = uStack_a88;
    local_5f8 = local_610;
    local_5e8 = local_600;
    local_5c8 = local_628;
    local_5b8 = local_5d0;
    local_5a8 = local_5e0;
    local_5a0 = local_628;
    local_590 = local_5e0;
    local_588 = local_628;
    local_578 = local_5e0;
    local_570 = local_628;
    local_560 = local_5e0;
    local_558 = local_628;
    local_548 = local_5e0;
    local_540 = local_628;
    local_530 = local_5e0;
    local_528 = local_628;
    local_518 = local_5e0;
    local_510 = local_628;
    local_500 = local_5e0;
    local_4f8 = local_628;
    local_4f0 = local_610;
    local_4d0 = local_610;
    local_4c8 = local_4e0;
    local_4b8 = local_610;
    local_4b0 = local_4e0;
    local_4a0 = local_610;
    local_498 = local_4e0;
    local_488 = local_610;
    local_480 = local_4e0;
    local_470 = local_610;
    local_468 = local_4e0;
    local_b0 = local_2310;
    uStack_a8 = uStack_2308;
    local_70 = local_a40;
    uStack_68 = uStack_a38;
  }
  for (; local_2294 < local_228c; local_2294 = local_2294 + 1) {
    local_21c8 = &local_228d;
    local_21d0 = local_2278;
    local_21d8 = local_2280;
    fVar89 = powf(*(float *)*local_2278,*local_2280);
    *local_2288 = fVar89;
    local_2278 = (undefined1 (*) [32])(*local_2278 + 4);
    local_2280 = local_2280 + 1;
    local_2288 = local_2288 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}